

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 uVar9;
  ulong uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  uint uVar69;
  long lVar70;
  ulong uVar71;
  byte bVar73;
  uint uVar74;
  long lVar75;
  undefined4 uVar76;
  bool bVar77;
  float fVar78;
  float fVar117;
  float fVar118;
  vint4 bi;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar119;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar95 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar120;
  float fVar154;
  float fVar155;
  vint4 bi_2;
  undefined1 auVar121 [16];
  float fVar156;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar130 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar206;
  float fVar207;
  vint4 ai_1;
  undefined1 auVar192 [16];
  float fVar208;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar209;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  float fVar210;
  float fVar211;
  float fVar237;
  float fVar239;
  vint4 ai_2;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar241;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar238;
  float fVar240;
  float fVar242;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  vint4 ai;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar268 [16];
  float fVar269;
  float fVar279;
  float fVar280;
  vfloat4 b0;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar281;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  float fVar299;
  float fVar306;
  float fVar307;
  undefined1 auVar300 [16];
  float fVar308;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar309;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  float fVar320;
  float fVar321;
  float fVar331;
  float fVar333;
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  float fVar332;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar330 [64];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar350;
  vfloat4 a0;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar360;
  float fVar364;
  float fVar365;
  undefined1 auVar361 [16];
  float fVar366;
  undefined1 auVar362 [16];
  float fVar367;
  undefined1 auVar363 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [8];
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  uint auStack_4c0 [4];
  RTCFilterFunctionNArguments local_4b0;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  float afStack_340 [8];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar72;
  undefined1 auVar267 [32];
  undefined1 auVar359 [32];
  
  PVar11 = prim[1];
  uVar68 = (ulong)(byte)PVar11;
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  lVar70 = uVar68 * 0x25;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar268 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x11 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar126 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar269 = *(float *)(prim + lVar70 + 0x12);
  auVar92 = vsubps_avx(auVar92,*(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar270._0_4_ = fVar269 * auVar92._0_4_;
  auVar270._4_4_ = fVar269 * auVar92._4_4_;
  auVar270._8_4_ = fVar269 * auVar92._8_4_;
  auVar270._12_4_ = fVar269 * auVar92._12_4_;
  auVar351._0_4_ = fVar269 * auVar126._0_4_;
  auVar351._4_4_ = fVar269 * auVar126._4_4_;
  auVar351._8_4_ = fVar269 * auVar126._8_4_;
  auVar351._12_4_ = fVar269 * auVar126._12_4_;
  auVar18 = vcvtdq2ps_avx(auVar186);
  auVar144 = vcvtdq2ps_avx(auVar19);
  auVar132 = vcvtdq2ps_avx(auVar20);
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar268 = vcvtdq2ps_avx(auVar268);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar92 = vshufps_avx(auVar351,auVar351,0);
  auVar126 = vshufps_avx(auVar351,auVar351,0x55);
  auVar186 = vshufps_avx(auVar351,auVar351,0xaa);
  fVar269 = auVar186._0_4_;
  fVar280 = auVar186._4_4_;
  fVar191 = auVar186._8_4_;
  fVar207 = auVar186._12_4_;
  fVar279 = auVar126._0_4_;
  fVar281 = auVar126._4_4_;
  fVar206 = auVar126._8_4_;
  fVar208 = auVar126._12_4_;
  fVar210 = auVar92._0_4_;
  fVar237 = auVar92._4_4_;
  fVar239 = auVar92._8_4_;
  fVar241 = auVar92._12_4_;
  auVar212._0_4_ = fVar210 * auVar18._0_4_ + auVar144._0_4_ * fVar279 + auVar132._0_4_ * fVar269;
  auVar212._4_4_ = fVar237 * auVar18._4_4_ + auVar144._4_4_ * fVar281 + auVar132._4_4_ * fVar280;
  auVar212._8_4_ = fVar239 * auVar18._8_4_ + auVar144._8_4_ * fVar206 + auVar132._8_4_ * fVar191;
  auVar212._12_4_ = fVar241 * auVar18._12_4_ + auVar144._12_4_ * fVar208 + auVar132._12_4_ * fVar207
  ;
  auVar192._0_4_ = fVar210 * auVar172._0_4_ + auVar133._0_4_ * fVar279 + auVar268._0_4_ * fVar269;
  auVar192._4_4_ = fVar237 * auVar172._4_4_ + auVar133._4_4_ * fVar281 + auVar268._4_4_ * fVar280;
  auVar192._8_4_ = fVar239 * auVar172._8_4_ + auVar133._8_4_ * fVar206 + auVar268._8_4_ * fVar191;
  auVar192._12_4_ =
       fVar241 * auVar172._12_4_ + auVar133._12_4_ * fVar208 + auVar268._12_4_ * fVar207;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar91 = vpmovsxwd_avx(auVar92);
  auVar92 = vcvtdq2ps_avx(auVar81);
  auVar322._0_4_ = fVar210 * auVar92._0_4_ + auVar21._0_4_ * fVar279 + auVar80._0_4_ * fVar269;
  auVar322._4_4_ = fVar237 * auVar92._4_4_ + auVar21._4_4_ * fVar281 + auVar80._4_4_ * fVar280;
  auVar322._8_4_ = fVar239 * auVar92._8_4_ + auVar21._8_4_ * fVar206 + auVar80._8_4_ * fVar191;
  auVar322._12_4_ = fVar241 * auVar92._12_4_ + auVar21._12_4_ * fVar208 + auVar80._12_4_ * fVar207;
  auVar126 = vshufps_avx(auVar270,auVar270,0xaa);
  fVar269 = auVar126._0_4_;
  fVar280 = auVar126._4_4_;
  fVar191 = auVar126._8_4_;
  fVar207 = auVar126._12_4_;
  auVar126 = vshufps_avx(auVar270,auVar270,0x55);
  fVar279 = auVar126._0_4_;
  fVar281 = auVar126._4_4_;
  fVar206 = auVar126._8_4_;
  fVar208 = auVar126._12_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar81 = vpmovsxwd_avx(auVar126);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar158 = vpmovsxwd_avx(auVar186);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar126 = vshufps_avx(auVar270,auVar270,0);
  fVar210 = auVar126._0_4_;
  fVar237 = auVar126._4_4_;
  fVar239 = auVar126._8_4_;
  fVar241 = auVar126._12_4_;
  auVar79._0_4_ = fVar210 * auVar18._0_4_ + auVar144._0_4_ * fVar279 + auVar132._0_4_ * fVar269;
  auVar79._4_4_ = fVar237 * auVar18._4_4_ + auVar144._4_4_ * fVar281 + auVar132._4_4_ * fVar280;
  auVar79._8_4_ = fVar239 * auVar18._8_4_ + auVar144._8_4_ * fVar206 + auVar132._8_4_ * fVar191;
  auVar79._12_4_ = fVar241 * auVar18._12_4_ + auVar144._12_4_ * fVar208 + auVar132._12_4_ * fVar207;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0x16 + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar157._0_4_ = auVar133._0_4_ * fVar279 + auVar268._0_4_ * fVar269 + fVar210 * auVar172._0_4_;
  auVar157._4_4_ = auVar133._4_4_ * fVar281 + auVar268._4_4_ * fVar280 + fVar237 * auVar172._4_4_;
  auVar157._8_4_ = auVar133._8_4_ * fVar206 + auVar268._8_4_ * fVar191 + fVar239 * auVar172._8_4_;
  auVar157._12_4_ =
       auVar133._12_4_ * fVar208 + auVar268._12_4_ * fVar207 + fVar241 * auVar172._12_4_;
  auVar121._0_4_ = auVar92._0_4_ * fVar210 + auVar21._0_4_ * fVar279 + auVar80._0_4_ * fVar269;
  auVar121._4_4_ = auVar92._4_4_ * fVar237 + auVar21._4_4_ * fVar281 + auVar80._4_4_ * fVar280;
  auVar121._8_4_ = auVar92._8_4_ * fVar239 + auVar21._8_4_ * fVar206 + auVar80._8_4_ * fVar191;
  auVar121._12_4_ = auVar92._12_4_ * fVar241 + auVar21._12_4_ * fVar208 + auVar80._12_4_ * fVar207;
  auVar352._8_4_ = 0x7fffffff;
  auVar352._0_8_ = 0x7fffffff7fffffff;
  auVar352._12_4_ = 0x7fffffff;
  auVar92 = vandps_avx(auVar352,auVar212);
  auVar310._8_4_ = 0x219392ef;
  auVar310._0_8_ = 0x219392ef219392ef;
  auVar310._12_4_ = 0x219392ef;
  auVar92 = vcmpps_avx(auVar92,auVar310,1);
  auVar126 = vblendvps_avx(auVar212,auVar310,auVar92);
  auVar92 = vandps_avx(auVar352,auVar192);
  auVar92 = vcmpps_avx(auVar92,auVar310,1);
  auVar186 = vblendvps_avx(auVar192,auVar310,auVar92);
  auVar92 = vandps_avx(auVar322,auVar352);
  auVar92 = vcmpps_avx(auVar92,auVar310,1);
  auVar92 = vblendvps_avx(auVar322,auVar310,auVar92);
  auVar144 = vrcpps_avx(auVar126);
  fVar191 = auVar144._0_4_;
  auVar213._0_4_ = fVar191 * auVar126._0_4_;
  fVar206 = auVar144._4_4_;
  auVar213._4_4_ = fVar206 * auVar126._4_4_;
  fVar207 = auVar144._8_4_;
  auVar213._8_4_ = fVar207 * auVar126._8_4_;
  fVar208 = auVar144._12_4_;
  auVar213._12_4_ = fVar208 * auVar126._12_4_;
  auVar323._8_4_ = 0x3f800000;
  auVar323._0_8_ = 0x3f8000003f800000;
  auVar323._12_4_ = 0x3f800000;
  auVar126 = vsubps_avx(auVar323,auVar213);
  fVar191 = fVar191 + fVar191 * auVar126._0_4_;
  fVar206 = fVar206 + fVar206 * auVar126._4_4_;
  fVar207 = fVar207 + fVar207 * auVar126._8_4_;
  fVar208 = fVar208 + fVar208 * auVar126._12_4_;
  auVar126 = vrcpps_avx(auVar186);
  fVar210 = auVar126._0_4_;
  auVar271._0_4_ = fVar210 * auVar186._0_4_;
  fVar237 = auVar126._4_4_;
  auVar271._4_4_ = fVar237 * auVar186._4_4_;
  fVar239 = auVar126._8_4_;
  auVar271._8_4_ = fVar239 * auVar186._8_4_;
  fVar241 = auVar126._12_4_;
  auVar271._12_4_ = fVar241 * auVar186._12_4_;
  auVar126 = vsubps_avx(auVar323,auVar271);
  fVar210 = fVar210 + fVar210 * auVar126._0_4_;
  fVar237 = fVar237 + fVar237 * auVar126._4_4_;
  fVar239 = fVar239 + fVar239 * auVar126._8_4_;
  fVar241 = fVar241 + fVar241 * auVar126._12_4_;
  auVar126 = vrcpps_avx(auVar92);
  fVar269 = auVar126._0_4_;
  auVar311._0_4_ = auVar92._0_4_ * fVar269;
  fVar279 = auVar126._4_4_;
  auVar311._4_4_ = auVar92._4_4_ * fVar279;
  fVar280 = auVar126._8_4_;
  auVar311._8_4_ = auVar92._8_4_ * fVar280;
  fVar281 = auVar126._12_4_;
  auVar311._12_4_ = auVar92._12_4_ * fVar281;
  auVar92 = vsubps_avx(auVar323,auVar311);
  fVar269 = auVar92._0_4_ * fVar269 + fVar269;
  fVar279 = auVar92._4_4_ * fVar279 + fVar279;
  fVar280 = auVar92._8_4_ * fVar280 + fVar280;
  fVar281 = auVar92._12_4_ * fVar281 + fVar281;
  auVar92 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar70 + 0x16)) *
                          *(float *)(prim + lVar70 + 0x1a)));
  auVar186 = vshufps_avx(auVar92,auVar92,0);
  auVar92 = vcvtdq2ps_avx(auVar91);
  auVar126 = vcvtdq2ps_avx(auVar81);
  auVar126 = vsubps_avx(auVar126,auVar92);
  fVar209 = auVar186._0_4_;
  fVar211 = auVar186._4_4_;
  fVar238 = auVar186._8_4_;
  fVar240 = auVar186._12_4_;
  auVar243._0_4_ = fVar209 * auVar126._0_4_ + auVar92._0_4_;
  auVar243._4_4_ = fVar211 * auVar126._4_4_ + auVar92._4_4_;
  auVar243._8_4_ = fVar238 * auVar126._8_4_ + auVar92._8_4_;
  auVar243._12_4_ = fVar240 * auVar126._12_4_ + auVar92._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar158);
  auVar126 = vcvtdq2ps_avx(auVar19);
  auVar126 = vsubps_avx(auVar126,auVar92);
  auVar259._0_4_ = fVar209 * auVar126._0_4_ + auVar92._0_4_;
  auVar259._4_4_ = fVar211 * auVar126._4_4_ + auVar92._4_4_;
  auVar259._8_4_ = fVar238 * auVar126._8_4_ + auVar92._8_4_;
  auVar259._12_4_ = fVar240 * auVar126._12_4_ + auVar92._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar20);
  auVar126 = vcvtdq2ps_avx(auVar18);
  auVar186 = vsubps_avx(auVar126,auVar92);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar126 = vpmovsxwd_avx(auVar144);
  auVar282._0_4_ = fVar209 * auVar186._0_4_ + auVar92._0_4_;
  auVar282._4_4_ = fVar211 * auVar186._4_4_ + auVar92._4_4_;
  auVar282._8_4_ = fVar238 * auVar186._8_4_ + auVar92._8_4_;
  auVar282._12_4_ = fVar240 * auVar186._12_4_ + auVar92._12_4_;
  auVar92 = vcvtdq2ps_avx(auVar126);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar126 = vpmovsxwd_avx(auVar132);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar92);
  auVar300._0_4_ = fVar209 * auVar126._0_4_ + auVar92._0_4_;
  auVar300._4_4_ = fVar211 * auVar126._4_4_ + auVar92._4_4_;
  auVar300._8_4_ = fVar238 * auVar126._8_4_ + auVar92._8_4_;
  auVar300._12_4_ = fVar240 * auVar126._12_4_ + auVar92._12_4_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar172);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar68 * 0x21 + 6);
  auVar126 = vpmovsxwd_avx(auVar133);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar92);
  auVar312._0_4_ = fVar209 * auVar126._0_4_ + auVar92._0_4_;
  auVar312._4_4_ = fVar211 * auVar126._4_4_ + auVar92._4_4_;
  auVar312._8_4_ = fVar238 * auVar126._8_4_ + auVar92._8_4_;
  auVar312._12_4_ = fVar240 * auVar126._12_4_ + auVar92._12_4_;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + uVar68 * 0x1f + 6);
  auVar92 = vpmovsxwd_avx(auVar268);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar126 = vpmovsxwd_avx(auVar21);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar92);
  auVar324._0_4_ = fVar209 * auVar126._0_4_ + auVar92._0_4_;
  auVar324._4_4_ = fVar211 * auVar126._4_4_ + auVar92._4_4_;
  auVar324._8_4_ = fVar238 * auVar126._8_4_ + auVar92._8_4_;
  auVar324._12_4_ = fVar240 * auVar126._12_4_ + auVar92._12_4_;
  auVar92 = vsubps_avx(auVar243,auVar79);
  auVar244._0_4_ = fVar191 * auVar92._0_4_;
  auVar244._4_4_ = fVar206 * auVar92._4_4_;
  auVar244._8_4_ = fVar207 * auVar92._8_4_;
  auVar244._12_4_ = fVar208 * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar259,auVar79);
  auVar80._0_4_ = fVar191 * auVar92._0_4_;
  auVar80._4_4_ = fVar206 * auVar92._4_4_;
  auVar80._8_4_ = fVar207 * auVar92._8_4_;
  auVar80._12_4_ = fVar208 * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar282,auVar157);
  auVar193._0_4_ = fVar210 * auVar92._0_4_;
  auVar193._4_4_ = fVar237 * auVar92._4_4_;
  auVar193._8_4_ = fVar239 * auVar92._8_4_;
  auVar193._12_4_ = fVar241 * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar300,auVar157);
  auVar158._0_4_ = fVar210 * auVar92._0_4_;
  auVar158._4_4_ = fVar237 * auVar92._4_4_;
  auVar158._8_4_ = fVar239 * auVar92._8_4_;
  auVar158._12_4_ = fVar241 * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar312,auVar121);
  auVar214._0_4_ = fVar269 * auVar92._0_4_;
  auVar214._4_4_ = fVar279 * auVar92._4_4_;
  auVar214._8_4_ = fVar280 * auVar92._8_4_;
  auVar214._12_4_ = fVar281 * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar324,auVar121);
  auVar91._0_4_ = fVar269 * auVar92._0_4_;
  auVar91._4_4_ = fVar279 * auVar92._4_4_;
  auVar91._8_4_ = fVar280 * auVar92._8_4_;
  auVar91._12_4_ = fVar281 * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar244,auVar80);
  auVar126 = vpminsd_avx(auVar193,auVar158);
  auVar92 = vmaxps_avx(auVar92,auVar126);
  auVar126 = vpminsd_avx(auVar214,auVar91);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar283._4_4_ = uVar76;
  auVar283._0_4_ = uVar76;
  auVar283._8_4_ = uVar76;
  auVar283._12_4_ = uVar76;
  auVar126 = vmaxps_avx(auVar126,auVar283);
  auVar92 = vmaxps_avx(auVar92,auVar126);
  local_430._0_4_ = auVar92._0_4_ * 0.99999964;
  local_430._4_4_ = auVar92._4_4_ * 0.99999964;
  local_430._8_4_ = auVar92._8_4_ * 0.99999964;
  local_430._12_4_ = auVar92._12_4_ * 0.99999964;
  auVar92 = vpmaxsd_avx(auVar244,auVar80);
  auVar126 = vpmaxsd_avx(auVar193,auVar158);
  auVar92 = vminps_avx(auVar92,auVar126);
  auVar126 = vpmaxsd_avx(auVar214,auVar91);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar159._4_4_ = uVar76;
  auVar159._0_4_ = uVar76;
  auVar159._8_4_ = uVar76;
  auVar159._12_4_ = uVar76;
  auVar126 = vminps_avx(auVar126,auVar159);
  auVar92 = vminps_avx(auVar92,auVar126);
  auVar81._0_4_ = auVar92._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar92._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar92._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar92._12_4_ * 1.0000004;
  auVar92 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar126 = vpcmpgtd_avx(auVar92,_DAT_01f4ad30);
  auVar92 = vcmpps_avx(local_430,auVar81,2);
  auVar92 = vandps_avx(auVar92,auVar126);
  uVar76 = vmovmskps_avx(auVar92);
  uVar68 = CONCAT44((int)((ulong)prim >> 0x20),uVar76);
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  uVar74 = 1 << ((byte)k & 0x1f);
  auVar59 = ZEXT412(0);
LAB_008bf28a:
  auVar61._12_4_ = 0;
  auVar61._0_12_ = auVar59;
  if (uVar68 == 0) {
LAB_008c1586:
    return uVar68 != 0;
  }
  lVar70 = 0;
  if (uVar68 != 0) {
    for (; (uVar68 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  uVar67 = *(uint *)(prim + 2);
  pGVar12 = (context->scene->geometries).items[uVar67].ptr;
  fVar269 = (pGVar12->time_range).lower;
  fVar269 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar269) / ((pGVar12->time_range).upper - fVar269));
  auVar92 = vroundss_avx(ZEXT416((uint)fVar269),ZEXT416((uint)fVar269),9);
  auVar92 = vminss_avx(auVar92,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar92 = vmaxss_avx(auVar61 << 0x20,auVar92);
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)*(uint *)(prim + lVar70 * 4 + 6) *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar92._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar75);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar75);
  pfVar4 = (float *)(lVar14 + lVar15 * uVar71);
  fVar279 = *pfVar4;
  fVar280 = pfVar4[1];
  fVar281 = pfVar4[2];
  fVar191 = pfVar4[3];
  lVar1 = uVar71 + 1;
  pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
  lVar2 = uVar71 + 2;
  pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
  lVar3 = uVar71 + 3;
  pfVar6 = (float *)(lVar14 + lVar15 * lVar3);
  fVar206 = *pfVar6;
  fVar207 = pfVar6[1];
  fVar208 = pfVar6[2];
  fVar210 = pfVar6[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar75);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar75);
  pfVar6 = (float *)(lVar15 + lVar16 * uVar71);
  fVar237 = *pfVar6;
  fVar239 = pfVar6[1];
  fVar241 = pfVar6[2];
  fVar209 = pfVar6[3];
  pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
  pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
  fVar269 = fVar269 - auVar92._0_4_;
  pfVar8 = (float *)(lVar15 + lVar16 * lVar3);
  fVar211 = *pfVar8;
  fVar238 = pfVar8[1];
  fVar240 = pfVar8[2];
  fVar242 = pfVar8[3];
  fVar299 = *pfVar5 * 0.0;
  fVar306 = pfVar5[1] * 0.0;
  fVar307 = pfVar5[2] * 0.0;
  fVar308 = pfVar5[3] * 0.0;
  fVar78 = fVar299 + fVar206 * 0.0;
  fVar117 = fVar306 + fVar207 * 0.0;
  fVar118 = fVar307 + fVar208 * 0.0;
  fVar119 = fVar308 + fVar210 * 0.0;
  fVar320 = *pfVar4 * 0.0;
  fVar331 = pfVar4[1] * 0.0;
  fVar333 = pfVar4[2] * 0.0;
  fVar335 = pfVar4[3] * 0.0;
  local_700._0_4_ = fVar279 + fVar320 + fVar78;
  local_700._4_4_ = fVar280 + fVar331 + fVar117;
  fStack_6f8 = fVar281 + fVar333 + fVar118;
  fStack_6f4 = fVar191 + fVar335 + fVar119;
  auVar82._0_4_ = *pfVar4 * 3.0 + fVar78;
  auVar82._4_4_ = pfVar4[1] * 3.0 + fVar117;
  auVar82._8_4_ = pfVar4[2] * 3.0 + fVar118;
  auVar82._12_4_ = pfVar4[3] * 3.0 + fVar119;
  auVar160._0_4_ = fVar279 * 3.0;
  auVar160._4_4_ = fVar280 * 3.0;
  auVar160._8_4_ = fVar281 * 3.0;
  auVar160._12_4_ = fVar191 * 3.0;
  auVar132 = vsubps_avx(auVar82,auVar160);
  fVar120 = *pfVar7 * 0.0;
  fVar154 = pfVar7[1] * 0.0;
  fVar155 = pfVar7[2] * 0.0;
  fVar156 = pfVar7[3] * 0.0;
  fVar78 = fVar120 + fVar211 * 0.0;
  fVar117 = fVar154 + fVar238 * 0.0;
  fVar118 = fVar155 + fVar240 * 0.0;
  fVar119 = fVar156 + fVar242 * 0.0;
  fVar344 = *pfVar6 * 0.0;
  fVar347 = pfVar6[1] * 0.0;
  fVar348 = pfVar6[2] * 0.0;
  fVar349 = pfVar6[3] * 0.0;
  auVar353._0_4_ = fVar344 + fVar78 + fVar237;
  auVar353._4_4_ = fVar347 + fVar117 + fVar239;
  auVar353._8_4_ = fVar348 + fVar118 + fVar241;
  auVar353._12_4_ = fVar349 + fVar119 + fVar209;
  auVar83._0_4_ = *pfVar6 * 3.0 + fVar78;
  auVar83._4_4_ = pfVar6[1] * 3.0 + fVar117;
  auVar83._8_4_ = pfVar6[2] * 3.0 + fVar118;
  auVar83._12_4_ = pfVar6[3] * 3.0 + fVar119;
  auVar260._0_4_ = fVar237 * 3.0;
  auVar260._4_4_ = fVar239 * 3.0;
  auVar260._8_4_ = fVar241 * 3.0;
  auVar260._12_4_ = fVar209 * 3.0;
  auVar19 = vsubps_avx(auVar83,auVar260);
  auVar194._0_4_ = fVar279 * 0.0;
  auVar194._4_4_ = fVar280 * 0.0;
  auVar194._8_4_ = fVar281 * 0.0;
  auVar194._12_4_ = fVar191 * 0.0;
  auVar261._0_4_ = auVar194._0_4_ + fVar320 + fVar299 + fVar206;
  auVar261._4_4_ = auVar194._4_4_ + fVar331 + fVar306 + fVar207;
  auVar261._8_4_ = auVar194._8_4_ + fVar333 + fVar307 + fVar208;
  auVar261._12_4_ = auVar194._12_4_ + fVar335 + fVar308 + fVar210;
  auVar272._0_4_ = fVar206 * 3.0;
  auVar272._4_4_ = fVar207 * 3.0;
  auVar272._8_4_ = fVar208 * 3.0;
  auVar272._12_4_ = fVar210 * 3.0;
  auVar215._0_4_ = *pfVar5 * 3.0;
  auVar215._4_4_ = pfVar5[1] * 3.0;
  auVar215._8_4_ = pfVar5[2] * 3.0;
  auVar215._12_4_ = pfVar5[3] * 3.0;
  auVar92 = vsubps_avx(auVar272,auVar215);
  auVar216._0_4_ = fVar320 + auVar92._0_4_;
  auVar216._4_4_ = fVar331 + auVar92._4_4_;
  auVar216._8_4_ = fVar333 + auVar92._8_4_;
  auVar216._12_4_ = fVar335 + auVar92._12_4_;
  auVar172 = vsubps_avx(auVar216,auVar194);
  auVar217._0_4_ = fVar237 * 0.0;
  auVar217._4_4_ = fVar239 * 0.0;
  auVar217._8_4_ = fVar241 * 0.0;
  auVar217._12_4_ = fVar209 * 0.0;
  auVar195._0_4_ = auVar217._0_4_ + fVar344 + fVar211 + fVar120;
  auVar195._4_4_ = auVar217._4_4_ + fVar347 + fVar238 + fVar154;
  auVar195._8_4_ = auVar217._8_4_ + fVar348 + fVar240 + fVar155;
  auVar195._12_4_ = auVar217._12_4_ + fVar349 + fVar242 + fVar156;
  auVar245._0_4_ = fVar211 * 3.0;
  auVar245._4_4_ = fVar238 * 3.0;
  auVar245._8_4_ = fVar240 * 3.0;
  auVar245._12_4_ = fVar242 * 3.0;
  auVar273._0_4_ = *pfVar7 * 3.0;
  auVar273._4_4_ = pfVar7[1] * 3.0;
  auVar273._8_4_ = pfVar7[2] * 3.0;
  auVar273._12_4_ = pfVar7[3] * 3.0;
  auVar92 = vsubps_avx(auVar245,auVar273);
  auVar246._0_4_ = fVar344 + auVar92._0_4_;
  auVar246._4_4_ = fVar347 + auVar92._4_4_;
  auVar246._8_4_ = fVar348 + auVar92._8_4_;
  auVar246._12_4_ = fVar349 + auVar92._12_4_;
  auVar18 = vsubps_avx(auVar246,auVar217);
  auVar92 = vshufps_avx(auVar132,auVar132,0xc9);
  auVar126 = vshufps_avx(auVar353,auVar353,0xc9);
  fVar78 = auVar132._0_4_;
  auVar247._0_4_ = fVar78 * auVar126._0_4_;
  fVar117 = auVar132._4_4_;
  auVar247._4_4_ = fVar117 * auVar126._4_4_;
  fVar118 = auVar132._8_4_;
  auVar247._8_4_ = fVar118 * auVar126._8_4_;
  fVar119 = auVar132._12_4_;
  auVar247._12_4_ = fVar119 * auVar126._12_4_;
  auVar284._0_4_ = auVar353._0_4_ * auVar92._0_4_;
  auVar284._4_4_ = auVar353._4_4_ * auVar92._4_4_;
  auVar284._8_4_ = auVar353._8_4_ * auVar92._8_4_;
  auVar284._12_4_ = auVar353._12_4_ * auVar92._12_4_;
  auVar126 = vsubps_avx(auVar284,auVar247);
  auVar186 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar126 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar285._0_4_ = auVar126._0_4_ * fVar78;
  auVar285._4_4_ = auVar126._4_4_ * fVar117;
  auVar285._8_4_ = auVar126._8_4_ * fVar118;
  auVar285._12_4_ = auVar126._12_4_ * fVar119;
  auVar84._0_4_ = auVar92._0_4_ * auVar19._0_4_;
  auVar84._4_4_ = auVar92._4_4_ * auVar19._4_4_;
  auVar84._8_4_ = auVar92._8_4_ * auVar19._8_4_;
  auVar84._12_4_ = auVar92._12_4_ * auVar19._12_4_;
  auVar92 = vsubps_avx(auVar84,auVar285);
  auVar19 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar126 = vshufps_avx(auVar172,auVar172,0xc9);
  auVar92 = vshufps_avx(auVar195,auVar195,0xc9);
  fVar344 = auVar172._0_4_;
  auVar286._0_4_ = fVar344 * auVar92._0_4_;
  fVar347 = auVar172._4_4_;
  auVar286._4_4_ = fVar347 * auVar92._4_4_;
  fVar348 = auVar172._8_4_;
  auVar286._8_4_ = fVar348 * auVar92._8_4_;
  fVar349 = auVar172._12_4_;
  auVar286._12_4_ = fVar349 * auVar92._12_4_;
  auVar196._0_4_ = auVar126._0_4_ * auVar195._0_4_;
  auVar196._4_4_ = auVar126._4_4_ * auVar195._4_4_;
  auVar196._8_4_ = auVar126._8_4_ * auVar195._8_4_;
  auVar196._12_4_ = auVar126._12_4_ * auVar195._12_4_;
  auVar92 = vsubps_avx(auVar196,auVar286);
  auVar20 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar92 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar287._0_4_ = fVar344 * auVar92._0_4_;
  auVar287._4_4_ = fVar347 * auVar92._4_4_;
  auVar287._8_4_ = fVar348 * auVar92._8_4_;
  auVar287._12_4_ = fVar349 * auVar92._12_4_;
  auVar92 = vdpps_avx(auVar186,auVar186,0x7f);
  auVar218._0_4_ = auVar126._0_4_ * auVar18._0_4_;
  auVar218._4_4_ = auVar126._4_4_ * auVar18._4_4_;
  auVar218._8_4_ = auVar126._8_4_ * auVar18._8_4_;
  auVar218._12_4_ = auVar126._12_4_ * auVar18._12_4_;
  auVar126 = vsubps_avx(auVar218,auVar287);
  auVar18 = vshufps_avx(auVar126,auVar126,0xc9);
  fVar280 = auVar92._0_4_;
  auVar274._4_12_ = ZEXT812(0) << 0x20;
  auVar274._0_4_ = fVar280;
  auVar126 = vrsqrtss_avx(auVar274,auVar274);
  fVar279 = auVar126._0_4_;
  auVar126 = ZEXT416((uint)(fVar279 * 1.5 - fVar280 * 0.5 * fVar279 * fVar279 * fVar279));
  auVar144 = vshufps_avx(auVar126,auVar126,0);
  auVar126 = vdpps_avx(auVar186,auVar19,0x7f);
  fVar211 = auVar144._0_4_ * auVar186._0_4_;
  fVar238 = auVar144._4_4_ * auVar186._4_4_;
  fVar240 = auVar144._8_4_ * auVar186._8_4_;
  fVar242 = auVar144._12_4_ * auVar186._12_4_;
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar85._0_4_ = auVar92._0_4_ * auVar19._0_4_;
  auVar85._4_4_ = auVar92._4_4_ * auVar19._4_4_;
  auVar85._8_4_ = auVar92._8_4_ * auVar19._8_4_;
  auVar85._12_4_ = auVar92._12_4_ * auVar19._12_4_;
  auVar92 = vshufps_avx(auVar126,auVar126,0);
  auVar248._0_4_ = auVar92._0_4_ * auVar186._0_4_;
  auVar248._4_4_ = auVar92._4_4_ * auVar186._4_4_;
  auVar248._8_4_ = auVar92._8_4_ * auVar186._8_4_;
  auVar248._12_4_ = auVar92._12_4_ * auVar186._12_4_;
  auVar133 = vsubps_avx(auVar85,auVar248);
  auVar92 = vrcpss_avx(auVar274,auVar274);
  auVar92 = ZEXT416((uint)(auVar92._0_4_ * (2.0 - fVar280 * auVar92._0_4_)));
  auVar186 = vshufps_avx(auVar92,auVar92,0);
  auVar92 = vdpps_avx(auVar20,auVar20,0x7f);
  fVar120 = auVar92._0_4_;
  auVar288._4_12_ = ZEXT812(0) << 0x20;
  auVar288._0_4_ = fVar120;
  auVar126 = vrsqrtss_avx(auVar288,auVar288);
  fVar237 = auVar126._0_4_;
  auVar126 = vdpps_avx(auVar20,auVar18,0x7f);
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar361._0_4_ = auVar18._0_4_ * auVar92._0_4_;
  auVar361._4_4_ = auVar18._4_4_ * auVar92._4_4_;
  auVar361._8_4_ = auVar18._8_4_ * auVar92._8_4_;
  auVar361._12_4_ = auVar18._12_4_ * auVar92._12_4_;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar75);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar75);
  pfVar4 = (float *)(lVar15 + lVar16 * uVar71);
  fVar279 = *pfVar4;
  fVar280 = pfVar4[1];
  fVar281 = pfVar4[2];
  fVar191 = pfVar4[3];
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  auVar92 = vshufps_avx(auVar126,auVar126,0);
  auVar86._0_4_ = auVar20._0_4_ * auVar92._0_4_;
  auVar86._4_4_ = auVar20._4_4_ * auVar92._4_4_;
  auVar86._8_4_ = auVar20._8_4_ * auVar92._8_4_;
  auVar86._12_4_ = auVar20._12_4_ * auVar92._12_4_;
  auVar18 = vsubps_avx(auVar361,auVar86);
  pfVar6 = (float *)(lVar15 + lVar16 * lVar3);
  fVar206 = *pfVar6;
  fVar207 = pfVar6[1];
  fVar208 = pfVar6[2];
  fVar210 = pfVar6[3];
  auVar92 = ZEXT416((uint)(fVar237 * 1.5 - fVar120 * 0.5 * fVar237 * fVar237 * fVar237));
  auVar126 = vshufps_avx(auVar92,auVar92,0);
  fVar237 = auVar126._0_4_ * auVar20._0_4_;
  fVar239 = auVar126._4_4_ * auVar20._4_4_;
  fVar241 = auVar126._8_4_ * auVar20._8_4_;
  fVar209 = auVar126._12_4_ * auVar20._12_4_;
  auVar92 = vrcpss_avx(auVar288,auVar288);
  auVar92 = ZEXT416((uint)(auVar92._0_4_ * (2.0 - auVar92._0_4_ * fVar120)));
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar19 = vshufps_avx(_local_700,_local_700,0xff);
  auVar354._0_4_ = auVar19._0_4_ * fVar211;
  auVar354._4_4_ = auVar19._4_4_ * fVar238;
  auVar354._8_4_ = auVar19._8_4_ * fVar240;
  auVar354._12_4_ = auVar19._12_4_ * fVar242;
  auVar20 = vshufps_avx(auVar132,auVar132,0xff);
  auVar268 = vsubps_avx(_local_700,auVar354);
  auVar275._0_4_ =
       auVar20._0_4_ * fVar211 + auVar19._0_4_ * auVar144._0_4_ * auVar133._0_4_ * auVar186._0_4_;
  auVar275._4_4_ =
       auVar20._4_4_ * fVar238 + auVar19._4_4_ * auVar144._4_4_ * auVar133._4_4_ * auVar186._4_4_;
  auVar275._8_4_ =
       auVar20._8_4_ * fVar240 + auVar19._8_4_ * auVar144._8_4_ * auVar133._8_4_ * auVar186._8_4_;
  auVar275._12_4_ =
       auVar20._12_4_ * fVar242 +
       auVar19._12_4_ * auVar144._12_4_ * auVar133._12_4_ * auVar186._12_4_;
  auVar144 = vsubps_avx(auVar132,auVar275);
  local_700._0_4_ = (float)local_700._0_4_ + auVar354._0_4_;
  local_700._4_4_ = (float)local_700._4_4_ + auVar354._4_4_;
  fStack_6f8 = fStack_6f8 + auVar354._8_4_;
  fStack_6f4 = fStack_6f4 + auVar354._12_4_;
  auVar186 = vshufps_avx(auVar261,auVar261,0xff);
  auVar161._0_4_ = auVar186._0_4_ * fVar237;
  auVar161._4_4_ = auVar186._4_4_ * fVar239;
  auVar161._8_4_ = auVar186._8_4_ * fVar241;
  auVar161._12_4_ = auVar186._12_4_ * fVar209;
  auVar19 = vshufps_avx(auVar172,auVar172,0xff);
  auVar132 = vsubps_avx(auVar261,auVar161);
  auVar87._0_4_ =
       auVar19._0_4_ * fVar237 + auVar186._0_4_ * auVar126._0_4_ * auVar18._0_4_ * auVar92._0_4_;
  auVar87._4_4_ =
       auVar19._4_4_ * fVar239 + auVar186._4_4_ * auVar126._4_4_ * auVar18._4_4_ * auVar92._4_4_;
  auVar87._8_4_ =
       auVar19._8_4_ * fVar241 + auVar186._8_4_ * auVar126._8_4_ * auVar18._8_4_ * auVar92._8_4_;
  auVar87._12_4_ =
       auVar19._12_4_ * fVar209 +
       auVar186._12_4_ * auVar126._12_4_ * auVar18._12_4_ * auVar92._12_4_;
  auVar172 = vsubps_avx(auVar172,auVar87);
  local_630._4_4_ = auVar261._4_4_ + auVar161._4_4_;
  local_630._0_4_ = auVar261._0_4_ + auVar161._0_4_;
  fStack_628 = auVar261._8_4_ + auVar161._8_4_;
  fStack_624 = auVar261._12_4_ + auVar161._12_4_;
  fVar299 = *pfVar5 * 0.0;
  fVar306 = pfVar5[1] * 0.0;
  fVar307 = pfVar5[2] * 0.0;
  fVar308 = pfVar5[3] * 0.0;
  fVar360 = fVar299 + fVar206 * 0.0;
  fVar364 = fVar306 + fVar207 * 0.0;
  fVar365 = fVar307 + fVar208 * 0.0;
  fVar367 = fVar308 + fVar210 * 0.0;
  auVar88._0_4_ = fVar360 + *pfVar4 * 3.0;
  auVar88._4_4_ = fVar364 + pfVar4[1] * 3.0;
  auVar88._8_4_ = fVar365 + pfVar4[2] * 3.0;
  auVar88._12_4_ = fVar367 + pfVar4[3] * 3.0;
  auVar162._0_4_ = fVar279 * 3.0;
  auVar162._4_4_ = fVar280 * 3.0;
  auVar162._8_4_ = fVar281 * 3.0;
  auVar162._12_4_ = fVar191 * 3.0;
  auVar133 = vsubps_avx(auVar88,auVar162);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar75);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar75);
  auVar92 = *(undefined1 (*) [16])(lVar15 + lVar2 * lVar14);
  pfVar6 = (float *)(lVar15 + lVar14 * lVar3);
  fVar237 = *pfVar6;
  fVar239 = pfVar6[1];
  fVar241 = pfVar6[2];
  fVar209 = pfVar6[3];
  fVar120 = auVar92._0_4_ * 0.0;
  fVar154 = auVar92._4_4_ * 0.0;
  fVar155 = auVar92._8_4_ * 0.0;
  fVar156 = auVar92._12_4_ * 0.0;
  fVar320 = fVar120 + fVar237 * 0.0;
  fVar331 = fVar154 + fVar239 * 0.0;
  fVar333 = fVar155 + fVar241 * 0.0;
  fVar335 = fVar156 + fVar209 * 0.0;
  pfVar6 = (float *)(lVar15 + lVar1 * lVar14);
  auVar355._0_4_ = *pfVar6 * 3.0 + fVar320;
  auVar355._4_4_ = pfVar6[1] * 3.0 + fVar331;
  auVar355._8_4_ = pfVar6[2] * 3.0 + fVar333;
  auVar355._12_4_ = pfVar6[3] * 3.0 + fVar335;
  pfVar7 = (float *)(lVar15 + uVar71 * lVar14);
  fVar211 = *pfVar7;
  fVar238 = pfVar7[1];
  fVar240 = pfVar7[2];
  fVar242 = pfVar7[3];
  auVar289._0_4_ = fVar211 * 3.0;
  auVar289._4_4_ = fVar238 * 3.0;
  auVar289._8_4_ = fVar240 * 3.0;
  auVar289._12_4_ = fVar242 * 3.0;
  auVar126 = vsubps_avx(auVar355,auVar289);
  auVar290._0_4_ = fVar206 * 3.0;
  auVar290._4_4_ = fVar207 * 3.0;
  auVar290._8_4_ = fVar208 * 3.0;
  auVar290._12_4_ = fVar210 * 3.0;
  auVar337._0_4_ = *pfVar5 * 3.0;
  auVar337._4_4_ = pfVar5[1] * 3.0;
  auVar337._8_4_ = pfVar5[2] * 3.0;
  auVar337._12_4_ = pfVar5[3] * 3.0;
  auVar186 = vsubps_avx(auVar290,auVar337);
  fVar321 = *pfVar4 * 0.0;
  fVar332 = pfVar4[1] * 0.0;
  fVar334 = pfVar4[2] * 0.0;
  fVar336 = pfVar4[3] * 0.0;
  auVar291._0_4_ = fVar321 + auVar186._0_4_;
  auVar291._4_4_ = fVar332 + auVar186._4_4_;
  auVar291._8_4_ = fVar334 + auVar186._8_4_;
  auVar291._12_4_ = fVar336 + auVar186._12_4_;
  auVar338._0_4_ = fVar279 + fVar321 + fVar360;
  auVar338._4_4_ = fVar280 + fVar332 + fVar364;
  auVar338._8_4_ = fVar281 + fVar334 + fVar365;
  auVar338._12_4_ = fVar191 + fVar336 + fVar367;
  auVar313._0_4_ = fVar279 * 0.0;
  auVar313._4_4_ = fVar280 * 0.0;
  auVar313._8_4_ = fVar281 * 0.0;
  auVar313._12_4_ = fVar191 * 0.0;
  local_660._0_4_ = auVar313._0_4_ + fVar321 + fVar206 + fVar299;
  local_660._4_4_ = auVar313._4_4_ + fVar332 + fVar207 + fVar306;
  fStack_658 = auVar313._8_4_ + fVar334 + fVar208 + fVar307;
  fStack_654 = auVar313._12_4_ + fVar336 + fVar210 + fVar308;
  auVar21 = vsubps_avx(auVar291,auVar313);
  auVar122._0_4_ = fVar237 * 3.0;
  auVar122._4_4_ = fVar239 * 3.0;
  auVar122._8_4_ = fVar241 * 3.0;
  auVar122._12_4_ = fVar209 * 3.0;
  auVar219._0_4_ = auVar92._0_4_ * 3.0;
  auVar219._4_4_ = auVar92._4_4_ * 3.0;
  auVar219._8_4_ = auVar92._8_4_ * 3.0;
  auVar219._12_4_ = auVar92._12_4_ * 3.0;
  auVar92 = vsubps_avx(auVar122,auVar219);
  fVar279 = *pfVar6 * 0.0;
  fVar280 = pfVar6[1] * 0.0;
  fVar281 = pfVar6[2] * 0.0;
  fVar191 = pfVar6[3] * 0.0;
  auVar123._0_4_ = fVar279 + auVar92._0_4_;
  auVar123._4_4_ = fVar280 + auVar92._4_4_;
  auVar123._8_4_ = fVar281 + auVar92._8_4_;
  auVar123._12_4_ = fVar191 + auVar92._12_4_;
  auVar163._0_4_ = fVar211 + fVar279 + fVar320;
  auVar163._4_4_ = fVar238 + fVar280 + fVar331;
  auVar163._8_4_ = fVar240 + fVar281 + fVar333;
  auVar163._12_4_ = fVar242 + fVar191 + fVar335;
  auVar89._0_4_ = fVar211 * 0.0;
  auVar89._4_4_ = fVar238 * 0.0;
  auVar89._8_4_ = fVar240 * 0.0;
  auVar89._12_4_ = fVar242 * 0.0;
  auVar197._0_4_ = auVar89._0_4_ + fVar279 + fVar120 + fVar237;
  auVar197._4_4_ = auVar89._4_4_ + fVar280 + fVar154 + fVar239;
  auVar197._8_4_ = auVar89._8_4_ + fVar281 + fVar155 + fVar241;
  auVar197._12_4_ = auVar89._12_4_ + fVar191 + fVar156 + fVar209;
  auVar19 = vsubps_avx(auVar123,auVar89);
  auVar92 = vshufps_avx(auVar163,auVar163,0xc9);
  fVar210 = auVar133._0_4_;
  auVar124._0_4_ = fVar210 * auVar92._0_4_;
  fVar237 = auVar133._4_4_;
  auVar124._4_4_ = fVar237 * auVar92._4_4_;
  fVar239 = auVar133._8_4_;
  auVar124._8_4_ = fVar239 * auVar92._8_4_;
  fVar241 = auVar133._12_4_;
  auVar124._12_4_ = fVar241 * auVar92._12_4_;
  auVar92 = vshufps_avx(auVar133,auVar133,0xc9);
  auVar164._0_4_ = auVar92._0_4_ * auVar163._0_4_;
  auVar164._4_4_ = auVar92._4_4_ * auVar163._4_4_;
  auVar164._8_4_ = auVar92._8_4_ * auVar163._8_4_;
  auVar164._12_4_ = auVar92._12_4_ * auVar163._12_4_;
  auVar186 = vsubps_avx(auVar164,auVar124);
  auVar165._0_4_ = auVar126._0_4_ * auVar92._0_4_;
  auVar165._4_4_ = auVar126._4_4_ * auVar92._4_4_;
  auVar165._8_4_ = auVar126._8_4_ * auVar92._8_4_;
  auVar165._12_4_ = auVar126._12_4_ * auVar92._12_4_;
  auVar92 = vshufps_avx(auVar126,auVar126,0xc9);
  auVar220._0_4_ = fVar210 * auVar92._0_4_;
  auVar220._4_4_ = fVar237 * auVar92._4_4_;
  auVar220._8_4_ = fVar239 * auVar92._8_4_;
  auVar220._12_4_ = fVar241 * auVar92._12_4_;
  auVar20 = vsubps_avx(auVar165,auVar220);
  auVar92 = vshufps_avx(auVar197,auVar197,0xc9);
  fVar209 = auVar21._0_4_;
  auVar221._0_4_ = fVar209 * auVar92._0_4_;
  fVar211 = auVar21._4_4_;
  auVar221._4_4_ = fVar211 * auVar92._4_4_;
  fVar238 = auVar21._8_4_;
  auVar221._8_4_ = fVar238 * auVar92._8_4_;
  fVar240 = auVar21._12_4_;
  auVar221._12_4_ = fVar240 * auVar92._12_4_;
  auVar92 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar198._0_4_ = auVar92._0_4_ * auVar197._0_4_;
  auVar198._4_4_ = auVar92._4_4_ * auVar197._4_4_;
  auVar198._8_4_ = auVar92._8_4_ * auVar197._8_4_;
  auVar198._12_4_ = auVar92._12_4_ * auVar197._12_4_;
  auVar18 = vsubps_avx(auVar198,auVar221);
  auVar186 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar125._0_4_ = auVar92._0_4_ * auVar19._0_4_;
  auVar125._4_4_ = auVar92._4_4_ * auVar19._4_4_;
  auVar125._8_4_ = auVar92._8_4_ * auVar19._8_4_;
  auVar125._12_4_ = auVar92._12_4_ * auVar19._12_4_;
  auVar92 = vdpps_avx(auVar186,auVar186,0x7f);
  auVar126 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar90._0_4_ = fVar209 * auVar126._0_4_;
  auVar90._4_4_ = fVar211 * auVar126._4_4_;
  auVar90._8_4_ = fVar238 * auVar126._8_4_;
  auVar90._12_4_ = fVar240 * auVar126._12_4_;
  auVar80 = vsubps_avx(auVar125,auVar90);
  fVar280 = auVar92._0_4_;
  auVar91 = ZEXT416((uint)fVar280);
  auVar126 = vrsqrtss_avx(auVar91,auVar91);
  fVar279 = auVar126._0_4_;
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar126 = vdpps_avx(auVar186,auVar19,0x7f);
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar166._0_4_ = auVar92._0_4_ * auVar19._0_4_;
  auVar166._4_4_ = auVar92._4_4_ * auVar19._4_4_;
  auVar166._8_4_ = auVar92._8_4_ * auVar19._8_4_;
  auVar166._12_4_ = auVar92._12_4_ * auVar19._12_4_;
  auVar92 = vshufps_avx(auVar126,auVar126,0);
  auVar222._0_4_ = auVar186._0_4_ * auVar92._0_4_;
  auVar222._4_4_ = auVar186._4_4_ * auVar92._4_4_;
  auVar222._8_4_ = auVar186._8_4_ * auVar92._8_4_;
  auVar222._12_4_ = auVar186._12_4_ * auVar92._12_4_;
  auVar81 = vsubps_avx(auVar166,auVar222);
  auVar92 = vrcpss_avx(auVar91,auVar91);
  auVar92 = ZEXT416((uint)(auVar92._0_4_ * (2.0 - fVar280 * auVar92._0_4_)));
  auVar19 = vshufps_avx(auVar92,auVar92,0);
  auVar20 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar92 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar126 = ZEXT416((uint)(fVar279 * 1.5 - fVar280 * 0.5 * fVar279 * fVar279 * fVar279));
  auVar18 = vshufps_avx(auVar126,auVar126,0);
  fVar206 = auVar186._0_4_ * auVar18._0_4_;
  fVar207 = auVar186._4_4_ * auVar18._4_4_;
  fVar208 = auVar186._8_4_ * auVar18._8_4_;
  fVar242 = auVar186._12_4_ * auVar18._12_4_;
  fVar280 = auVar92._0_4_;
  auVar91 = ZEXT416((uint)fVar280);
  auVar126 = vrsqrtss_avx(auVar91,auVar91);
  fVar279 = auVar126._0_4_;
  auVar186 = vshufps_avx(auVar80,auVar80,0xc9);
  auVar126 = vdpps_avx(auVar20,auVar186,0x7f);
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar223._0_4_ = auVar92._0_4_ * auVar186._0_4_;
  auVar223._4_4_ = auVar92._4_4_ * auVar186._4_4_;
  auVar223._8_4_ = auVar92._8_4_ * auVar186._8_4_;
  auVar223._12_4_ = auVar92._12_4_ * auVar186._12_4_;
  auVar92 = vshufps_avx(auVar126,auVar126,0);
  auVar249._0_4_ = auVar20._0_4_ * auVar92._0_4_;
  auVar249._4_4_ = auVar20._4_4_ * auVar92._4_4_;
  auVar249._8_4_ = auVar20._8_4_ * auVar92._8_4_;
  auVar249._12_4_ = auVar20._12_4_ * auVar92._12_4_;
  auVar80 = vsubps_avx(auVar223,auVar249);
  auVar92 = vrcpss_avx(auVar91,auVar91);
  auVar92 = ZEXT416((uint)(auVar92._0_4_ * (2.0 - fVar280 * auVar92._0_4_)));
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar126 = ZEXT416((uint)(fVar279 * 1.5 - fVar280 * 0.5 * fVar279 * fVar279 * fVar279));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  fVar279 = auVar20._0_4_ * auVar126._0_4_;
  fVar280 = auVar20._4_4_ * auVar126._4_4_;
  fVar281 = auVar20._8_4_ * auVar126._8_4_;
  fVar191 = auVar20._12_4_ * auVar126._12_4_;
  auVar186 = vshufps_avx(auVar133,auVar133,0xff);
  auVar20 = vshufps_avx(auVar338,auVar338,0xff);
  auVar224._0_4_ = fVar206 * auVar20._0_4_;
  auVar224._4_4_ = fVar207 * auVar20._4_4_;
  auVar224._8_4_ = fVar208 * auVar20._8_4_;
  auVar224._12_4_ = fVar242 * auVar20._12_4_;
  auVar127._0_4_ =
       fVar206 * auVar186._0_4_ + auVar18._0_4_ * auVar81._0_4_ * auVar19._0_4_ * auVar20._0_4_;
  auVar127._4_4_ =
       fVar207 * auVar186._4_4_ + auVar18._4_4_ * auVar81._4_4_ * auVar19._4_4_ * auVar20._4_4_;
  auVar127._8_4_ =
       fVar208 * auVar186._8_4_ + auVar18._8_4_ * auVar81._8_4_ * auVar19._8_4_ * auVar20._8_4_;
  auVar127._12_4_ =
       fVar242 * auVar186._12_4_ + auVar18._12_4_ * auVar81._12_4_ * auVar19._12_4_ * auVar20._12_4_
  ;
  auVar20 = vsubps_avx(auVar338,auVar224);
  auVar18 = vsubps_avx(auVar133,auVar127);
  auVar186 = vshufps_avx(auVar21,auVar21,0xff);
  auVar19 = vshufps_avx(_local_660,_local_660,0xff);
  auVar167._0_4_ = auVar19._0_4_ * fVar279;
  auVar167._4_4_ = auVar19._4_4_ * fVar280;
  auVar167._8_4_ = auVar19._8_4_ * fVar281;
  auVar167._12_4_ = auVar19._12_4_ * fVar191;
  auVar93._0_4_ =
       auVar186._0_4_ * fVar279 + auVar19._0_4_ * auVar126._0_4_ * auVar80._0_4_ * auVar92._0_4_;
  auVar93._4_4_ =
       auVar186._4_4_ * fVar280 + auVar19._4_4_ * auVar126._4_4_ * auVar80._4_4_ * auVar92._4_4_;
  auVar93._8_4_ =
       auVar186._8_4_ * fVar281 + auVar19._8_4_ * auVar126._8_4_ * auVar80._8_4_ * auVar92._8_4_;
  auVar93._12_4_ =
       auVar186._12_4_ * fVar191 +
       auVar19._12_4_ * auVar126._12_4_ * auVar80._12_4_ * auVar92._12_4_;
  auVar186 = vsubps_avx(_local_660,auVar167);
  auVar345._0_4_ = (float)local_660._0_4_ + auVar167._0_4_;
  auVar345._4_4_ = (float)local_660._4_4_ + auVar167._4_4_;
  auVar345._8_4_ = fStack_658 + auVar167._8_4_;
  auVar345._12_4_ = fStack_654 + auVar167._12_4_;
  auVar19 = vsubps_avx(auVar21,auVar93);
  local_620 = auVar144._0_4_;
  fStack_61c = auVar144._4_4_;
  fStack_618 = auVar144._8_4_;
  fStack_614 = auVar144._12_4_;
  local_600 = auVar268._0_4_;
  fStack_5fc = auVar268._4_4_;
  fStack_5f8 = auVar268._8_4_;
  fStack_5f4 = auVar268._12_4_;
  auVar92 = vshufps_avx(ZEXT416((uint)fVar269),ZEXT416((uint)fVar269),0);
  auVar126 = vshufps_avx(ZEXT416((uint)(1.0 - fVar269)),ZEXT416((uint)(1.0 - fVar269)),0);
  fVar191 = auVar92._0_4_;
  fVar206 = auVar92._4_4_;
  fVar207 = auVar92._8_4_;
  fVar208 = auVar92._12_4_;
  fVar269 = auVar126._0_4_;
  fVar279 = auVar126._4_4_;
  fVar280 = auVar126._8_4_;
  fVar281 = auVar126._12_4_;
  local_4d0._0_4_ = fVar269 * local_600 + fVar191 * auVar20._0_4_;
  local_4d0._4_4_ = fVar279 * fStack_5fc + fVar206 * auVar20._4_4_;
  fStack_4c8 = fVar280 * fStack_5f8 + fVar207 * auVar20._8_4_;
  fStack_4c4 = fVar281 * fStack_5f4 + fVar208 * auVar20._12_4_;
  fVar120 = fVar269 * (local_600 + local_620 * 0.33333334) +
            fVar191 * (auVar20._0_4_ + auVar18._0_4_ * 0.33333334);
  fVar154 = fVar279 * (fStack_5fc + fStack_61c * 0.33333334) +
            fVar206 * (auVar20._4_4_ + auVar18._4_4_ * 0.33333334);
  fVar155 = fVar280 * (fStack_5f8 + fStack_618 * 0.33333334) +
            fVar207 * (auVar20._8_4_ + auVar18._8_4_ * 0.33333334);
  fVar156 = fVar281 * (fStack_5f4 + fStack_614 * 0.33333334) +
            fVar208 * (auVar20._12_4_ + auVar18._12_4_ * 0.33333334);
  local_6a0 = auVar172._0_4_;
  fStack_69c = auVar172._4_4_;
  fStack_698 = auVar172._8_4_;
  fStack_694 = auVar172._12_4_;
  auVar199._0_4_ = local_6a0 * 0.33333334;
  auVar199._4_4_ = fStack_69c * 0.33333334;
  auVar199._8_4_ = fStack_698 * 0.33333334;
  auVar199._12_4_ = fStack_694 * 0.33333334;
  auVar92 = vsubps_avx(auVar132,auVar199);
  auVar250._0_4_ = (fVar344 + auVar87._0_4_) * 0.33333334;
  auVar250._4_4_ = (fVar347 + auVar87._4_4_) * 0.33333334;
  auVar250._8_4_ = (fVar348 + auVar87._8_4_) * 0.33333334;
  auVar250._12_4_ = (fVar349 + auVar87._12_4_) * 0.33333334;
  auVar126 = vsubps_avx(_local_630,auVar250);
  auVar168._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar168._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar168._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar168._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar186,auVar168);
  auVar128._0_4_ = (fVar209 + auVar93._0_4_) * 0.33333334;
  auVar128._4_4_ = (fVar211 + auVar93._4_4_) * 0.33333334;
  auVar128._8_4_ = (fVar238 + auVar93._8_4_) * 0.33333334;
  auVar128._12_4_ = (fVar240 + auVar93._12_4_) * 0.33333334;
  auVar20 = vsubps_avx(auVar345,auVar128);
  local_4e0._0_4_ = fVar269 * auVar92._0_4_ + fVar191 * auVar19._0_4_;
  local_4e0._4_4_ = fVar279 * auVar92._4_4_ + fVar206 * auVar19._4_4_;
  fStack_4d8 = fVar280 * auVar92._8_4_ + fVar207 * auVar19._8_4_;
  fStack_4d4 = fVar281 * auVar92._12_4_ + fVar208 * auVar19._12_4_;
  local_4f0._0_4_ = fVar191 * auVar186._0_4_ + auVar132._0_4_ * fVar269;
  local_4f0._4_4_ = fVar206 * auVar186._4_4_ + auVar132._4_4_ * fVar279;
  fStack_4e8 = fVar207 * auVar186._8_4_ + auVar132._8_4_ * fVar280;
  fStack_4e4 = fVar208 * auVar186._12_4_ + auVar132._12_4_ * fVar281;
  local_500._0_4_ = fVar269 * (float)local_700._0_4_ + fVar191 * (auVar338._0_4_ + auVar224._0_4_);
  local_500._4_4_ = fVar279 * (float)local_700._4_4_ + fVar206 * (auVar338._4_4_ + auVar224._4_4_);
  fStack_4f8 = fVar280 * fStack_6f8 + fVar207 * (auVar338._8_4_ + auVar224._8_4_);
  fStack_4f4 = fVar281 * fStack_6f4 + fVar208 * (auVar338._12_4_ + auVar224._12_4_);
  local_510._0_4_ =
       fVar269 * ((float)local_700._0_4_ + (fVar78 + auVar275._0_4_) * 0.33333334) +
       fVar191 * (auVar338._0_4_ + auVar224._0_4_ + (fVar210 + auVar127._0_4_) * 0.33333334);
  local_510._4_4_ =
       fVar279 * ((float)local_700._4_4_ + (fVar117 + auVar275._4_4_) * 0.33333334) +
       fVar206 * (auVar338._4_4_ + auVar224._4_4_ + (fVar237 + auVar127._4_4_) * 0.33333334);
  fStack_508 = fVar280 * (fStack_6f8 + (fVar118 + auVar275._8_4_) * 0.33333334) +
               fVar207 * (auVar338._8_4_ + auVar224._8_4_ + (fVar239 + auVar127._8_4_) * 0.33333334)
  ;
  fStack_504 = fVar281 * (fStack_6f4 + (fVar119 + auVar275._12_4_) * 0.33333334) +
               fVar208 * (auVar338._12_4_ + auVar224._12_4_ +
                         (fVar241 + auVar127._12_4_) * 0.33333334);
  local_440._0_4_ = fVar269 * auVar126._0_4_ + fVar191 * auVar20._0_4_;
  local_440._4_4_ = fVar279 * auVar126._4_4_ + fVar206 * auVar20._4_4_;
  fStack_438 = fVar280 * auVar126._8_4_ + fVar207 * auVar20._8_4_;
  fStack_434 = fVar281 * auVar126._12_4_ + fVar208 * auVar20._12_4_;
  fVar209 = (auVar261._0_4_ + auVar161._0_4_) * fVar269 + fVar191 * auVar345._0_4_;
  fVar238 = (auVar261._4_4_ + auVar161._4_4_) * fVar279 + fVar206 * auVar345._4_4_;
  fVar242 = (auVar261._8_4_ + auVar161._8_4_) * fVar280 + fVar207 * auVar345._8_4_;
  fVar78 = (auVar261._12_4_ + auVar161._12_4_) * fVar281 + fVar208 * auVar345._12_4_;
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_3a0 = vsubps_avx(_local_4d0,auVar92);
  auVar186 = vmovsldup_avx(local_3a0);
  auVar126 = vmovshdup_avx(local_3a0);
  auVar19 = vshufps_avx(local_3a0,local_3a0,0xaa);
  fVar269 = pre->ray_space[k].vx.field_0.m128[0];
  fVar279 = pre->ray_space[k].vx.field_0.m128[1];
  fVar280 = pre->ray_space[k].vx.field_0.m128[2];
  fVar281 = pre->ray_space[k].vx.field_0.m128[3];
  fVar191 = pre->ray_space[k].vy.field_0.m128[0];
  fVar206 = pre->ray_space[k].vy.field_0.m128[1];
  fVar207 = pre->ray_space[k].vy.field_0.m128[2];
  fVar208 = pre->ray_space[k].vy.field_0.m128[3];
  fVar210 = pre->ray_space[k].vz.field_0.m128[0];
  fVar237 = pre->ray_space[k].vz.field_0.m128[1];
  fVar239 = pre->ray_space[k].vz.field_0.m128[2];
  fVar241 = pre->ray_space[k].vz.field_0.m128[3];
  local_710._0_4_ = fVar269 * auVar186._0_4_ + fVar191 * auVar126._0_4_ + fVar210 * auVar19._0_4_;
  local_710._4_4_ = fVar279 * auVar186._4_4_ + fVar206 * auVar126._4_4_ + fVar237 * auVar19._4_4_;
  fStack_708 = fVar280 * auVar186._8_4_ + fVar207 * auVar126._8_4_ + fVar239 * auVar19._8_4_;
  fStack_704 = fVar281 * auVar186._12_4_ + fVar208 * auVar126._12_4_ + fVar241 * auVar19._12_4_;
  auVar64._4_4_ = fVar154;
  auVar64._0_4_ = fVar120;
  auVar64._8_4_ = fVar155;
  auVar64._12_4_ = fVar156;
  local_3b0 = vsubps_avx(auVar64,auVar92);
  auVar19 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar126 = vmovshdup_avx(local_3b0);
  auVar186 = vmovsldup_avx(local_3b0);
  fVar211 = fVar269 * auVar186._0_4_ + fVar191 * auVar126._0_4_ + fVar210 * auVar19._0_4_;
  fVar240 = fVar279 * auVar186._4_4_ + fVar206 * auVar126._4_4_ + fVar237 * auVar19._4_4_;
  local_700._4_4_ = fVar240;
  local_700._0_4_ = fVar211;
  fStack_6f8 = fVar280 * auVar186._8_4_ + fVar207 * auVar126._8_4_ + fVar239 * auVar19._8_4_;
  fStack_6f4 = fVar281 * auVar186._12_4_ + fVar208 * auVar126._12_4_ + fVar241 * auVar19._12_4_;
  local_3c0 = vsubps_avx(_local_4e0,auVar92);
  auVar19 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar126 = vmovshdup_avx(local_3c0);
  auVar186 = vmovsldup_avx(local_3c0);
  auVar200._0_4_ = fVar269 * auVar186._0_4_ + fVar191 * auVar126._0_4_ + fVar210 * auVar19._0_4_;
  auVar200._4_4_ = fVar279 * auVar186._4_4_ + fVar206 * auVar126._4_4_ + fVar237 * auVar19._4_4_;
  auVar200._8_4_ = fVar280 * auVar186._8_4_ + fVar207 * auVar126._8_4_ + fVar239 * auVar19._8_4_;
  auVar200._12_4_ = fVar281 * auVar186._12_4_ + fVar208 * auVar126._12_4_ + fVar241 * auVar19._12_4_
  ;
  local_3d0 = vsubps_avx(_local_4f0,auVar92);
  auVar19 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar126 = vmovshdup_avx(local_3d0);
  auVar186 = vmovsldup_avx(local_3d0);
  auVar129._0_4_ = auVar186._0_4_ * fVar269 + auVar126._0_4_ * fVar191 + fVar210 * auVar19._0_4_;
  auVar129._4_4_ = auVar186._4_4_ * fVar279 + auVar126._4_4_ * fVar206 + fVar237 * auVar19._4_4_;
  auVar129._8_4_ = auVar186._8_4_ * fVar280 + auVar126._8_4_ * fVar207 + fVar239 * auVar19._8_4_;
  auVar129._12_4_ = auVar186._12_4_ * fVar281 + auVar126._12_4_ * fVar208 + fVar241 * auVar19._12_4_
  ;
  local_3e0 = vsubps_avx(_local_500,auVar92);
  auVar19 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar126 = vmovshdup_avx(local_3e0);
  auVar186 = vmovsldup_avx(local_3e0);
  auVar292._0_4_ = auVar186._0_4_ * fVar269 + auVar126._0_4_ * fVar191 + auVar19._0_4_ * fVar210;
  auVar292._4_4_ = auVar186._4_4_ * fVar279 + auVar126._4_4_ * fVar206 + auVar19._4_4_ * fVar237;
  auVar292._8_4_ = auVar186._8_4_ * fVar280 + auVar126._8_4_ * fVar207 + auVar19._8_4_ * fVar239;
  auVar292._12_4_ = auVar186._12_4_ * fVar281 + auVar126._12_4_ * fVar208 + auVar19._12_4_ * fVar241
  ;
  local_3f0 = vsubps_avx(_local_510,auVar92);
  auVar19 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar126 = vmovshdup_avx(local_3f0);
  auVar186 = vmovsldup_avx(local_3f0);
  auVar301._0_4_ = auVar186._0_4_ * fVar269 + auVar126._0_4_ * fVar191 + auVar19._0_4_ * fVar210;
  auVar301._4_4_ = auVar186._4_4_ * fVar279 + auVar126._4_4_ * fVar206 + auVar19._4_4_ * fVar237;
  auVar301._8_4_ = auVar186._8_4_ * fVar280 + auVar126._8_4_ * fVar207 + auVar19._8_4_ * fVar239;
  auVar301._12_4_ = auVar186._12_4_ * fVar281 + auVar126._12_4_ * fVar208 + auVar19._12_4_ * fVar241
  ;
  local_400 = vsubps_avx(_local_440,auVar92);
  auVar19 = vshufps_avx(local_400,local_400,0xaa);
  auVar126 = vmovshdup_avx(local_400);
  auVar186 = vmovsldup_avx(local_400);
  auVar314._0_4_ = auVar186._0_4_ * fVar269 + auVar126._0_4_ * fVar191 + auVar19._0_4_ * fVar210;
  auVar314._4_4_ = auVar186._4_4_ * fVar279 + auVar126._4_4_ * fVar206 + auVar19._4_4_ * fVar237;
  auVar314._8_4_ = auVar186._8_4_ * fVar280 + auVar126._8_4_ * fVar207 + auVar19._8_4_ * fVar239;
  auVar314._12_4_ = auVar186._12_4_ * fVar281 + auVar126._12_4_ * fVar208 + auVar19._12_4_ * fVar241
  ;
  auVar62._4_4_ = fVar238;
  auVar62._0_4_ = fVar209;
  auVar62._8_4_ = fVar242;
  auVar62._12_4_ = fVar78;
  local_410 = vsubps_avx(auVar62,auVar92);
  auVar186 = vshufps_avx(local_410,local_410,0xaa);
  auVar92 = vmovshdup_avx(local_410);
  auVar126 = vmovsldup_avx(local_410);
  auVar94._0_4_ = fVar269 * auVar126._0_4_ + fVar191 * auVar92._0_4_ + fVar210 * auVar186._0_4_;
  auVar94._4_4_ = fVar279 * auVar126._4_4_ + fVar206 * auVar92._4_4_ + fVar237 * auVar186._4_4_;
  auVar94._8_4_ = fVar280 * auVar126._8_4_ + fVar207 * auVar92._8_4_ + fVar239 * auVar186._8_4_;
  auVar94._12_4_ = fVar281 * auVar126._12_4_ + fVar208 * auVar92._12_4_ + fVar241 * auVar186._12_4_;
  auVar19 = vmovlhps_avx(_local_710,auVar292);
  auVar20 = vmovlhps_avx(_local_700,auVar301);
  auVar18 = vmovlhps_avx(auVar200,auVar314);
  _local_380 = vmovlhps_avx(auVar129,auVar94);
  auVar92 = vminps_avx(auVar19,auVar20);
  auVar126 = vminps_avx(auVar18,_local_380);
  auVar186 = vminps_avx(auVar92,auVar126);
  auVar92 = vmaxps_avx(auVar19,auVar20);
  auVar126 = vmaxps_avx(auVar18,_local_380);
  auVar92 = vmaxps_avx(auVar92,auVar126);
  auVar126 = vshufpd_avx(auVar186,auVar186,3);
  auVar186 = vminps_avx(auVar186,auVar126);
  auVar126 = vshufpd_avx(auVar92,auVar92,3);
  auVar126 = vmaxps_avx(auVar92,auVar126);
  auVar262._8_4_ = 0x7fffffff;
  auVar262._0_8_ = 0x7fffffff7fffffff;
  auVar262._12_4_ = 0x7fffffff;
  auVar92 = vandps_avx(auVar186,auVar262);
  auVar126 = vandps_avx(auVar126,auVar262);
  auVar92 = vmaxps_avx(auVar92,auVar126);
  auVar126 = vmovshdup_avx(auVar92);
  auVar92 = vmaxss_avx(auVar126,auVar92);
  fVar269 = auVar92._0_4_ * 9.536743e-07;
  local_390 = ZEXT416((uint)fVar269);
  auVar92 = vshufps_avx(ZEXT416((uint)fVar269),ZEXT416((uint)fVar269),0);
  local_1c0._16_16_ = auVar92;
  local_1c0._0_16_ = auVar92;
  auVar95._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
  auVar95._8_4_ = auVar92._8_4_ ^ 0x80000000;
  auVar95._12_4_ = auVar92._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar95;
  local_1e0._0_16_ = auVar95;
  auVar92 = vpshufd_avx(ZEXT416(uVar67),0);
  local_300._16_16_ = auVar92;
  local_300._0_16_ = auVar92;
  auVar92 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar70 * 4 + 6)),0);
  local_320._16_16_ = auVar92;
  local_320._0_16_ = auVar92;
  bVar77 = false;
  uVar71 = 0;
  fVar269 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar20,auVar19);
  _local_360 = vsubps_avx(auVar18,auVar20);
  _local_370 = vsubps_avx(_local_380,auVar18);
  _local_450 = vsubps_avx(_local_500,_local_4d0);
  auVar65._4_4_ = fVar154;
  auVar65._0_4_ = fVar120;
  auVar65._8_4_ = fVar155;
  auVar65._12_4_ = fVar156;
  _local_460 = vsubps_avx(_local_510,auVar65);
  _local_470 = vsubps_avx(_local_440,_local_4e0);
  auVar63._4_4_ = fVar238;
  auVar63._0_4_ = fVar209;
  auVar63._8_4_ = fVar242;
  auVar63._12_4_ = fVar78;
  _local_480 = vsubps_avx(auVar63,_local_4f0);
  auVar330 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar363 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_008bfe9d:
  local_420 = auVar363._0_16_;
  auVar81 = auVar330._0_16_;
  auVar92 = vshufps_avx(auVar81,auVar81,0x50);
  auVar356._8_4_ = 0x3f800000;
  auVar356._0_8_ = 0x3f8000003f800000;
  auVar356._12_4_ = 0x3f800000;
  auVar359._16_4_ = 0x3f800000;
  auVar359._0_16_ = auVar356;
  auVar359._20_4_ = 0x3f800000;
  auVar359._24_4_ = 0x3f800000;
  auVar359._28_4_ = 0x3f800000;
  auVar126 = vsubps_avx(auVar356,auVar92);
  fVar279 = auVar92._0_4_;
  fVar280 = auVar92._4_4_;
  fVar281 = auVar92._8_4_;
  fVar191 = auVar92._12_4_;
  fVar206 = auVar126._0_4_;
  fVar207 = auVar126._4_4_;
  fVar208 = auVar126._8_4_;
  fVar210 = auVar126._12_4_;
  auVar201._0_4_ = auVar292._0_4_ * fVar279 + fVar206 * (float)local_710._0_4_;
  auVar201._4_4_ = auVar292._4_4_ * fVar280 + fVar207 * (float)local_710._4_4_;
  auVar201._8_4_ = auVar292._0_4_ * fVar281 + fVar208 * (float)local_710._0_4_;
  auVar201._12_4_ = auVar292._4_4_ * fVar191 + fVar210 * (float)local_710._4_4_;
  auVar169._0_4_ = auVar301._0_4_ * fVar279 + fVar211 * fVar206;
  auVar169._4_4_ = auVar301._4_4_ * fVar280 + fVar240 * fVar207;
  auVar169._8_4_ = auVar301._0_4_ * fVar281 + fVar211 * fVar208;
  auVar169._12_4_ = auVar301._4_4_ * fVar191 + fVar240 * fVar210;
  auVar276._0_4_ = auVar314._0_4_ * fVar279 + auVar200._0_4_ * fVar206;
  auVar276._4_4_ = auVar314._4_4_ * fVar280 + auVar200._4_4_ * fVar207;
  auVar276._8_4_ = auVar314._0_4_ * fVar281 + auVar200._0_4_ * fVar208;
  auVar276._12_4_ = auVar314._4_4_ * fVar191 + auVar200._4_4_ * fVar210;
  auVar225._0_4_ = auVar94._0_4_ * fVar279 + auVar129._0_4_ * fVar206;
  auVar225._4_4_ = auVar94._4_4_ * fVar280 + auVar129._4_4_ * fVar207;
  auVar225._8_4_ = auVar94._0_4_ * fVar281 + auVar129._0_4_ * fVar208;
  auVar225._12_4_ = auVar94._4_4_ * fVar191 + auVar129._4_4_ * fVar210;
  auVar92 = vmovshdup_avx(local_420);
  auVar126 = vshufps_avx(local_420,local_420,0);
  auVar304._16_16_ = auVar126;
  auVar304._0_16_ = auVar126;
  auVar186 = vshufps_avx(local_420,local_420,0x55);
  auVar111._16_16_ = auVar186;
  auVar111._0_16_ = auVar186;
  auVar110 = vsubps_avx(auVar111,auVar304);
  auVar186 = vshufps_avx(auVar201,auVar201,0);
  auVar144 = vshufps_avx(auVar201,auVar201,0x55);
  auVar132 = vshufps_avx(auVar169,auVar169,0);
  auVar172 = vshufps_avx(auVar169,auVar169,0x55);
  auVar133 = vshufps_avx(auVar276,auVar276,0);
  auVar268 = vshufps_avx(auVar276,auVar276,0x55);
  auVar21 = vshufps_avx(auVar225,auVar225,0);
  auVar80 = vshufps_avx(auVar225,auVar225,0x55);
  auVar92 = ZEXT416((uint)((auVar92._0_4_ - auVar363._0_4_) * 0.04761905));
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar319._0_4_ = auVar126._0_4_ + auVar110._0_4_ * 0.0;
  auVar319._4_4_ = auVar126._4_4_ + auVar110._4_4_ * 0.14285715;
  auVar319._8_4_ = auVar126._8_4_ + auVar110._8_4_ * 0.2857143;
  auVar319._12_4_ = auVar126._12_4_ + auVar110._12_4_ * 0.42857146;
  auVar319._16_4_ = auVar126._0_4_ + auVar110._16_4_ * 0.5714286;
  auVar319._20_4_ = auVar126._4_4_ + auVar110._20_4_ * 0.71428573;
  auVar319._24_4_ = auVar126._8_4_ + auVar110._24_4_ * 0.8571429;
  auVar319._28_4_ = auVar126._12_4_ + auVar110._28_4_;
  auVar22 = vsubps_avx(auVar359,auVar319);
  fVar279 = auVar132._0_4_;
  fVar281 = auVar132._4_4_;
  fVar206 = auVar132._8_4_;
  fVar208 = auVar132._12_4_;
  fVar334 = auVar22._0_4_;
  fVar336 = auVar22._4_4_;
  fVar360 = auVar22._8_4_;
  fVar364 = auVar22._12_4_;
  fVar365 = auVar22._16_4_;
  fVar367 = auVar22._20_4_;
  fVar309 = auVar22._24_4_;
  fVar333 = auVar172._0_4_;
  fVar344 = auVar172._4_4_;
  fVar348 = auVar172._8_4_;
  fVar321 = auVar172._12_4_;
  fVar350 = auVar144._12_4_ + 1.0;
  fVar307 = auVar133._0_4_;
  fVar308 = auVar133._4_4_;
  fVar320 = auVar133._8_4_;
  fVar331 = auVar133._12_4_;
  fVar237 = fVar307 * auVar319._0_4_ + fVar334 * fVar279;
  fVar239 = fVar308 * auVar319._4_4_ + fVar336 * fVar281;
  fVar241 = fVar320 * auVar319._8_4_ + fVar360 * fVar206;
  fVar117 = fVar331 * auVar319._12_4_ + fVar364 * fVar208;
  fVar118 = fVar307 * auVar319._16_4_ + fVar365 * fVar279;
  fVar119 = fVar308 * auVar319._20_4_ + fVar367 * fVar281;
  fVar299 = fVar320 * auVar319._24_4_ + fVar309 * fVar206;
  fVar280 = auVar268._0_4_;
  fVar191 = auVar268._4_4_;
  fVar207 = auVar268._8_4_;
  fVar210 = auVar268._12_4_;
  fVar335 = fVar333 * fVar334 + auVar319._0_4_ * fVar280;
  fVar347 = fVar344 * fVar336 + auVar319._4_4_ * fVar191;
  fVar349 = fVar348 * fVar360 + auVar319._8_4_ * fVar207;
  fVar332 = fVar321 * fVar364 + auVar319._12_4_ * fVar210;
  fVar340 = fVar333 * fVar365 + auVar319._16_4_ * fVar280;
  fVar341 = fVar344 * fVar367 + auVar319._20_4_ * fVar191;
  fVar342 = fVar348 * fVar309 + auVar319._24_4_ * fVar207;
  fVar343 = fVar321 + fVar208;
  auVar126 = vshufps_avx(auVar201,auVar201,0xaa);
  auVar132 = vshufps_avx(auVar201,auVar201,0xff);
  fVar306 = fVar331 + 0.0;
  auVar172 = vshufps_avx(auVar169,auVar169,0xaa);
  auVar133 = vshufps_avx(auVar169,auVar169,0xff);
  auVar235._0_4_ =
       fVar334 * (auVar319._0_4_ * fVar279 + fVar334 * auVar186._0_4_) + auVar319._0_4_ * fVar237;
  auVar235._4_4_ =
       fVar336 * (auVar319._4_4_ * fVar281 + fVar336 * auVar186._4_4_) + auVar319._4_4_ * fVar239;
  auVar235._8_4_ =
       fVar360 * (auVar319._8_4_ * fVar206 + fVar360 * auVar186._8_4_) + auVar319._8_4_ * fVar241;
  auVar235._12_4_ =
       fVar364 * (auVar319._12_4_ * fVar208 + fVar364 * auVar186._12_4_) + auVar319._12_4_ * fVar117
  ;
  auVar235._16_4_ =
       fVar365 * (auVar319._16_4_ * fVar279 + fVar365 * auVar186._0_4_) + auVar319._16_4_ * fVar118;
  auVar235._20_4_ =
       fVar367 * (auVar319._20_4_ * fVar281 + fVar367 * auVar186._4_4_) + auVar319._20_4_ * fVar119;
  auVar235._24_4_ =
       fVar309 * (auVar319._24_4_ * fVar206 + fVar309 * auVar186._8_4_) + auVar319._24_4_ * fVar299;
  auVar235._28_4_ = auVar186._12_4_ + 1.0 + fVar210;
  auVar257._0_4_ =
       fVar334 * (fVar333 * auVar319._0_4_ + auVar144._0_4_ * fVar334) + auVar319._0_4_ * fVar335;
  auVar257._4_4_ =
       fVar336 * (fVar344 * auVar319._4_4_ + auVar144._4_4_ * fVar336) + auVar319._4_4_ * fVar347;
  auVar257._8_4_ =
       fVar360 * (fVar348 * auVar319._8_4_ + auVar144._8_4_ * fVar360) + auVar319._8_4_ * fVar349;
  auVar257._12_4_ =
       fVar364 * (fVar321 * auVar319._12_4_ + auVar144._12_4_ * fVar364) + auVar319._12_4_ * fVar332
  ;
  auVar257._16_4_ =
       fVar365 * (fVar333 * auVar319._16_4_ + auVar144._0_4_ * fVar365) + auVar319._16_4_ * fVar340;
  auVar257._20_4_ =
       fVar367 * (fVar344 * auVar319._20_4_ + auVar144._4_4_ * fVar367) + auVar319._20_4_ * fVar341;
  auVar257._24_4_ =
       fVar309 * (fVar348 * auVar319._24_4_ + auVar144._8_4_ * fVar309) + auVar319._24_4_ * fVar342;
  auVar257._28_4_ = auVar80._12_4_ + fVar210;
  auVar112._0_4_ =
       fVar334 * fVar237 + auVar319._0_4_ * (fVar307 * fVar334 + auVar21._0_4_ * auVar319._0_4_);
  auVar112._4_4_ =
       fVar336 * fVar239 + auVar319._4_4_ * (fVar308 * fVar336 + auVar21._4_4_ * auVar319._4_4_);
  auVar112._8_4_ =
       fVar360 * fVar241 + auVar319._8_4_ * (fVar320 * fVar360 + auVar21._8_4_ * auVar319._8_4_);
  auVar112._12_4_ =
       fVar364 * fVar117 + auVar319._12_4_ * (fVar331 * fVar364 + auVar21._12_4_ * auVar319._12_4_);
  auVar112._16_4_ =
       fVar365 * fVar118 + auVar319._16_4_ * (fVar307 * fVar365 + auVar21._0_4_ * auVar319._16_4_);
  auVar112._20_4_ =
       fVar367 * fVar119 + auVar319._20_4_ * (fVar308 * fVar367 + auVar21._4_4_ * auVar319._20_4_);
  auVar112._24_4_ =
       fVar309 * fVar299 + auVar319._24_4_ * (fVar320 * fVar309 + auVar21._8_4_ * auVar319._24_4_);
  auVar112._28_4_ = fVar208 + 1.0 + fVar306;
  auVar329._0_4_ =
       fVar334 * fVar335 + auVar319._0_4_ * (auVar80._0_4_ * auVar319._0_4_ + fVar334 * fVar280);
  auVar329._4_4_ =
       fVar336 * fVar347 + auVar319._4_4_ * (auVar80._4_4_ * auVar319._4_4_ + fVar336 * fVar191);
  auVar329._8_4_ =
       fVar360 * fVar349 + auVar319._8_4_ * (auVar80._8_4_ * auVar319._8_4_ + fVar360 * fVar207);
  auVar329._12_4_ =
       fVar364 * fVar332 + auVar319._12_4_ * (auVar80._12_4_ * auVar319._12_4_ + fVar364 * fVar210);
  auVar329._16_4_ =
       fVar365 * fVar340 + auVar319._16_4_ * (auVar80._0_4_ * auVar319._16_4_ + fVar365 * fVar280);
  auVar329._20_4_ =
       fVar367 * fVar341 + auVar319._20_4_ * (auVar80._4_4_ * auVar319._20_4_ + fVar367 * fVar191);
  auVar329._24_4_ =
       fVar309 * fVar342 + auVar319._24_4_ * (auVar80._8_4_ * auVar319._24_4_ + fVar309 * fVar207);
  auVar329._28_4_ = fVar306 + fVar210 + 0.0;
  local_220._0_4_ = fVar334 * auVar235._0_4_ + auVar319._0_4_ * auVar112._0_4_;
  local_220._4_4_ = fVar336 * auVar235._4_4_ + auVar319._4_4_ * auVar112._4_4_;
  local_220._8_4_ = fVar360 * auVar235._8_4_ + auVar319._8_4_ * auVar112._8_4_;
  local_220._12_4_ = fVar364 * auVar235._12_4_ + auVar319._12_4_ * auVar112._12_4_;
  local_220._16_4_ = fVar365 * auVar235._16_4_ + auVar319._16_4_ * auVar112._16_4_;
  local_220._20_4_ = fVar367 * auVar235._20_4_ + auVar319._20_4_ * auVar112._20_4_;
  local_220._24_4_ = fVar309 * auVar235._24_4_ + auVar319._24_4_ * auVar112._24_4_;
  local_220._28_4_ = fVar343 + fVar210 + 0.0;
  auVar205._0_4_ = fVar334 * auVar257._0_4_ + auVar319._0_4_ * auVar329._0_4_;
  auVar205._4_4_ = fVar336 * auVar257._4_4_ + auVar319._4_4_ * auVar329._4_4_;
  auVar205._8_4_ = fVar360 * auVar257._8_4_ + auVar319._8_4_ * auVar329._8_4_;
  auVar205._12_4_ = fVar364 * auVar257._12_4_ + auVar319._12_4_ * auVar329._12_4_;
  auVar205._16_4_ = fVar365 * auVar257._16_4_ + auVar319._16_4_ * auVar329._16_4_;
  auVar205._20_4_ = fVar367 * auVar257._20_4_ + auVar319._20_4_ * auVar329._20_4_;
  auVar205._24_4_ = fVar309 * auVar257._24_4_ + auVar319._24_4_ * auVar329._24_4_;
  auVar205._28_4_ = fVar343 + fVar306;
  auVar23 = vsubps_avx(auVar112,auVar235);
  auVar110 = vsubps_avx(auVar329,auVar257);
  local_620 = auVar92._0_4_;
  fStack_61c = auVar92._4_4_;
  fStack_618 = auVar92._8_4_;
  fStack_614 = auVar92._12_4_;
  local_260 = local_620 * auVar23._0_4_ * 3.0;
  fStack_25c = fStack_61c * auVar23._4_4_ * 3.0;
  auVar24._4_4_ = fStack_25c;
  auVar24._0_4_ = local_260;
  fStack_258 = fStack_618 * auVar23._8_4_ * 3.0;
  auVar24._8_4_ = fStack_258;
  fStack_254 = fStack_614 * auVar23._12_4_ * 3.0;
  auVar24._12_4_ = fStack_254;
  fStack_250 = local_620 * auVar23._16_4_ * 3.0;
  auVar24._16_4_ = fStack_250;
  fStack_24c = fStack_61c * auVar23._20_4_ * 3.0;
  auVar24._20_4_ = fStack_24c;
  fStack_248 = fStack_618 * auVar23._24_4_ * 3.0;
  auVar24._24_4_ = fStack_248;
  auVar24._28_4_ = auVar23._28_4_;
  local_280 = local_620 * auVar110._0_4_ * 3.0;
  fStack_27c = fStack_61c * auVar110._4_4_ * 3.0;
  auVar25._4_4_ = fStack_27c;
  auVar25._0_4_ = local_280;
  fStack_278 = fStack_618 * auVar110._8_4_ * 3.0;
  auVar25._8_4_ = fStack_278;
  fStack_274 = fStack_614 * auVar110._12_4_ * 3.0;
  auVar25._12_4_ = fStack_274;
  fStack_270 = local_620 * auVar110._16_4_ * 3.0;
  auVar25._16_4_ = fStack_270;
  fStack_26c = fStack_61c * auVar110._20_4_ * 3.0;
  auVar25._20_4_ = fStack_26c;
  fStack_268 = fStack_618 * auVar110._24_4_ * 3.0;
  auVar25._24_4_ = fStack_268;
  auVar25._28_4_ = fVar343;
  auVar24 = vsubps_avx(local_220,auVar24);
  auVar110 = vperm2f128_avx(auVar24,auVar24,1);
  auVar110 = vshufps_avx(auVar110,auVar24,0x30);
  auVar110 = vshufps_avx(auVar24,auVar110,0x29);
  auVar25 = vsubps_avx(auVar205,auVar25);
  auVar24 = vperm2f128_avx(auVar25,auVar25,1);
  auVar24 = vshufps_avx(auVar24,auVar25,0x30);
  auVar25 = vshufps_avx(auVar25,auVar24,0x29);
  fVar341 = auVar172._0_4_;
  fVar342 = auVar172._4_4_;
  fVar366 = auVar172._8_4_;
  fVar208 = auVar126._12_4_;
  fVar308 = auVar133._0_4_;
  fVar331 = auVar133._4_4_;
  fVar335 = auVar133._8_4_;
  fVar347 = auVar133._12_4_;
  auVar92 = vshufps_avx(auVar276,auVar276,0xaa);
  fVar279 = auVar92._0_4_;
  fVar281 = auVar92._4_4_;
  fVar206 = auVar92._8_4_;
  fVar210 = auVar92._12_4_;
  fVar241 = auVar319._0_4_ * fVar279 + fVar341 * fVar334;
  fVar117 = auVar319._4_4_ * fVar281 + fVar342 * fVar336;
  fVar118 = auVar319._8_4_ * fVar206 + fVar366 * fVar360;
  fVar119 = auVar319._12_4_ * fVar210 + auVar172._12_4_ * fVar364;
  fVar299 = auVar319._16_4_ * fVar279 + fVar341 * fVar365;
  fVar306 = auVar319._20_4_ * fVar281 + fVar342 * fVar367;
  fVar307 = auVar319._24_4_ * fVar206 + fVar366 * fVar309;
  auVar92 = vshufps_avx(auVar276,auVar276,0xff);
  fVar280 = auVar92._0_4_;
  fVar191 = auVar92._4_4_;
  fVar207 = auVar92._8_4_;
  fVar237 = auVar92._12_4_;
  fVar320 = auVar319._0_4_ * fVar280 + fVar308 * fVar334;
  fVar333 = auVar319._4_4_ * fVar191 + fVar331 * fVar336;
  fVar344 = auVar319._8_4_ * fVar207 + fVar335 * fVar360;
  fVar348 = auVar319._12_4_ * fVar237 + fVar347 * fVar364;
  fVar349 = auVar319._16_4_ * fVar280 + fVar308 * fVar365;
  fVar321 = auVar319._20_4_ * fVar191 + fVar331 * fVar367;
  fVar332 = auVar319._24_4_ * fVar207 + fVar335 * fVar309;
  auVar92 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar340 = auVar92._12_4_ + fVar210;
  auVar186 = vshufps_avx(auVar225,auVar225,0xff);
  fVar239 = auVar186._12_4_;
  auVar113._0_4_ =
       fVar334 * (fVar341 * auVar319._0_4_ + fVar334 * auVar126._0_4_) + auVar319._0_4_ * fVar241;
  auVar113._4_4_ =
       fVar336 * (fVar342 * auVar319._4_4_ + fVar336 * auVar126._4_4_) + auVar319._4_4_ * fVar117;
  auVar113._8_4_ =
       fVar360 * (fVar366 * auVar319._8_4_ + fVar360 * auVar126._8_4_) + auVar319._8_4_ * fVar118;
  auVar113._12_4_ =
       fVar364 * (auVar172._12_4_ * auVar319._12_4_ + fVar364 * fVar208) + auVar319._12_4_ * fVar119
  ;
  auVar113._16_4_ =
       fVar365 * (fVar341 * auVar319._16_4_ + fVar365 * auVar126._0_4_) + auVar319._16_4_ * fVar299;
  auVar113._20_4_ =
       fVar367 * (fVar342 * auVar319._20_4_ + fVar367 * auVar126._4_4_) + auVar319._20_4_ * fVar306;
  auVar113._24_4_ =
       fVar309 * (fVar366 * auVar319._24_4_ + fVar309 * auVar126._8_4_) + auVar319._24_4_ * fVar307;
  auVar113._28_4_ = auVar25._28_4_ + fVar208 + fVar239;
  auVar149._0_4_ =
       fVar334 * (fVar308 * auVar319._0_4_ + auVar132._0_4_ * fVar334) + auVar319._0_4_ * fVar320;
  auVar149._4_4_ =
       fVar336 * (fVar331 * auVar319._4_4_ + auVar132._4_4_ * fVar336) + auVar319._4_4_ * fVar333;
  auVar149._8_4_ =
       fVar360 * (fVar335 * auVar319._8_4_ + auVar132._8_4_ * fVar360) + auVar319._8_4_ * fVar344;
  auVar149._12_4_ =
       fVar364 * (fVar347 * auVar319._12_4_ + auVar132._12_4_ * fVar364) + auVar319._12_4_ * fVar348
  ;
  auVar149._16_4_ =
       fVar365 * (fVar308 * auVar319._16_4_ + auVar132._0_4_ * fVar365) + auVar319._16_4_ * fVar349;
  auVar149._20_4_ =
       fVar367 * (fVar331 * auVar319._20_4_ + auVar132._4_4_ * fVar367) + auVar319._20_4_ * fVar321;
  auVar149._24_4_ =
       fVar309 * (fVar335 * auVar319._24_4_ + auVar132._8_4_ * fVar309) + auVar319._24_4_ * fVar332;
  auVar149._28_4_ = fVar208 + auVar24._28_4_ + fVar239;
  auVar24 = vperm2f128_avx(local_220,local_220,1);
  auVar24 = vshufps_avx(auVar24,local_220,0x30);
  auVar111 = vshufps_avx(local_220,auVar24,0x29);
  auVar258._0_4_ =
       auVar319._0_4_ * (auVar92._0_4_ * auVar319._0_4_ + fVar334 * fVar279) + fVar334 * fVar241;
  auVar258._4_4_ =
       auVar319._4_4_ * (auVar92._4_4_ * auVar319._4_4_ + fVar336 * fVar281) + fVar336 * fVar117;
  auVar258._8_4_ =
       auVar319._8_4_ * (auVar92._8_4_ * auVar319._8_4_ + fVar360 * fVar206) + fVar360 * fVar118;
  auVar258._12_4_ =
       auVar319._12_4_ * (auVar92._12_4_ * auVar319._12_4_ + fVar364 * fVar210) + fVar364 * fVar119;
  auVar258._16_4_ =
       auVar319._16_4_ * (auVar92._0_4_ * auVar319._16_4_ + fVar365 * fVar279) + fVar365 * fVar299;
  auVar258._20_4_ =
       auVar319._20_4_ * (auVar92._4_4_ * auVar319._20_4_ + fVar367 * fVar281) + fVar367 * fVar306;
  auVar258._24_4_ =
       auVar319._24_4_ * (auVar92._8_4_ * auVar319._24_4_ + fVar309 * fVar206) + fVar309 * fVar307;
  auVar258._28_4_ = fVar340 + fVar350 + auVar257._28_4_;
  auVar298._0_4_ =
       fVar334 * fVar320 + auVar319._0_4_ * (auVar319._0_4_ * auVar186._0_4_ + fVar334 * fVar280);
  auVar298._4_4_ =
       fVar336 * fVar333 + auVar319._4_4_ * (auVar319._4_4_ * auVar186._4_4_ + fVar336 * fVar191);
  auVar298._8_4_ =
       fVar360 * fVar344 + auVar319._8_4_ * (auVar319._8_4_ * auVar186._8_4_ + fVar360 * fVar207);
  auVar298._12_4_ =
       fVar364 * fVar348 + auVar319._12_4_ * (auVar319._12_4_ * fVar239 + fVar364 * fVar237);
  auVar298._16_4_ =
       fVar365 * fVar349 + auVar319._16_4_ * (auVar319._16_4_ * auVar186._0_4_ + fVar365 * fVar280);
  auVar298._20_4_ =
       fVar367 * fVar321 + auVar319._20_4_ * (auVar319._20_4_ * auVar186._4_4_ + fVar367 * fVar191);
  auVar298._24_4_ =
       fVar309 * fVar332 + auVar319._24_4_ * (auVar319._24_4_ * auVar186._8_4_ + fVar309 * fVar207);
  auVar298._28_4_ = fVar350 + fVar347 + fVar239 + fVar237;
  auVar278._0_4_ = fVar334 * auVar113._0_4_ + auVar319._0_4_ * auVar258._0_4_;
  auVar278._4_4_ = fVar336 * auVar113._4_4_ + auVar319._4_4_ * auVar258._4_4_;
  auVar278._8_4_ = fVar360 * auVar113._8_4_ + auVar319._8_4_ * auVar258._8_4_;
  auVar278._12_4_ = fVar364 * auVar113._12_4_ + auVar319._12_4_ * auVar258._12_4_;
  auVar278._16_4_ = fVar365 * auVar113._16_4_ + auVar319._16_4_ * auVar258._16_4_;
  auVar278._20_4_ = fVar367 * auVar113._20_4_ + auVar319._20_4_ * auVar258._20_4_;
  auVar278._24_4_ = fVar309 * auVar113._24_4_ + auVar319._24_4_ * auVar258._24_4_;
  auVar278._28_4_ = fVar340 + fVar239 + fVar237;
  auVar305._0_4_ = fVar334 * auVar149._0_4_ + auVar319._0_4_ * auVar298._0_4_;
  auVar305._4_4_ = fVar336 * auVar149._4_4_ + auVar319._4_4_ * auVar298._4_4_;
  auVar305._8_4_ = fVar360 * auVar149._8_4_ + auVar319._8_4_ * auVar298._8_4_;
  auVar305._12_4_ = fVar364 * auVar149._12_4_ + auVar319._12_4_ * auVar298._12_4_;
  auVar305._16_4_ = fVar365 * auVar149._16_4_ + auVar319._16_4_ * auVar298._16_4_;
  auVar305._20_4_ = fVar367 * auVar149._20_4_ + auVar319._20_4_ * auVar298._20_4_;
  auVar305._24_4_ = fVar309 * auVar149._24_4_ + auVar319._24_4_ * auVar298._24_4_;
  auVar305._28_4_ = auVar22._28_4_ + auVar319._28_4_;
  auVar26 = vsubps_avx(auVar258,auVar113);
  auVar24 = vsubps_avx(auVar298,auVar149);
  local_2a0 = local_620 * auVar26._0_4_ * 3.0;
  fStack_29c = fStack_61c * auVar26._4_4_ * 3.0;
  auVar22._4_4_ = fStack_29c;
  auVar22._0_4_ = local_2a0;
  fStack_298 = fStack_618 * auVar26._8_4_ * 3.0;
  auVar22._8_4_ = fStack_298;
  fStack_294 = fStack_614 * auVar26._12_4_ * 3.0;
  auVar22._12_4_ = fStack_294;
  fStack_290 = local_620 * auVar26._16_4_ * 3.0;
  auVar22._16_4_ = fStack_290;
  fStack_28c = fStack_61c * auVar26._20_4_ * 3.0;
  auVar22._20_4_ = fStack_28c;
  fStack_288 = fStack_618 * auVar26._24_4_ * 3.0;
  auVar22._24_4_ = fStack_288;
  auVar22._28_4_ = auVar26._28_4_;
  local_2c0 = local_620 * auVar24._0_4_ * 3.0;
  fStack_2bc = fStack_61c * auVar24._4_4_ * 3.0;
  auVar27._4_4_ = fStack_2bc;
  auVar27._0_4_ = local_2c0;
  fStack_2b8 = fStack_618 * auVar24._8_4_ * 3.0;
  auVar27._8_4_ = fStack_2b8;
  fStack_2b4 = fStack_614 * auVar24._12_4_ * 3.0;
  auVar27._12_4_ = fStack_2b4;
  fStack_2b0 = local_620 * auVar24._16_4_ * 3.0;
  auVar27._16_4_ = fStack_2b0;
  fStack_2ac = fStack_61c * auVar24._20_4_ * 3.0;
  auVar27._20_4_ = fStack_2ac;
  fStack_2a8 = fStack_618 * auVar24._24_4_ * 3.0;
  auVar27._24_4_ = fStack_2a8;
  auVar27._28_4_ = auVar258._28_4_;
  auVar24 = vperm2f128_avx(auVar278,auVar278,1);
  auVar24 = vshufps_avx(auVar24,auVar278,0x30);
  auVar112 = vshufps_avx(auVar278,auVar24,0x29);
  auVar22 = vsubps_avx(auVar278,auVar22);
  auVar24 = vperm2f128_avx(auVar22,auVar22,1);
  auVar24 = vshufps_avx(auVar24,auVar22,0x30);
  auVar24 = vshufps_avx(auVar22,auVar24,0x29);
  auVar27 = vsubps_avx(auVar305,auVar27);
  auVar22 = vperm2f128_avx(auVar27,auVar27,1);
  auVar22 = vshufps_avx(auVar22,auVar27,0x30);
  local_200 = vshufps_avx(auVar27,auVar22,0x29);
  auVar28 = vsubps_avx(auVar278,local_220);
  auVar113 = vsubps_avx(auVar112,auVar111);
  fVar279 = auVar113._0_4_ + auVar28._0_4_;
  fVar280 = auVar113._4_4_ + auVar28._4_4_;
  fVar281 = auVar113._8_4_ + auVar28._8_4_;
  fVar191 = auVar113._12_4_ + auVar28._12_4_;
  fVar206 = auVar113._16_4_ + auVar28._16_4_;
  fVar207 = auVar113._20_4_ + auVar28._20_4_;
  fVar208 = auVar113._24_4_ + auVar28._24_4_;
  auVar22 = vperm2f128_avx(auVar205,auVar205,1);
  auVar22 = vshufps_avx(auVar22,auVar205,0x30);
  local_240 = vshufps_avx(auVar205,auVar22,0x29);
  auVar22 = vperm2f128_avx(auVar305,auVar305,1);
  auVar22 = vshufps_avx(auVar22,auVar305,0x30);
  auVar27 = vshufps_avx(auVar305,auVar22,0x29);
  auVar22 = vsubps_avx(auVar305,auVar205);
  auVar149 = vsubps_avx(auVar27,local_240);
  fVar210 = auVar149._0_4_ + auVar22._0_4_;
  fVar237 = auVar149._4_4_ + auVar22._4_4_;
  fVar239 = auVar149._8_4_ + auVar22._8_4_;
  fVar241 = auVar149._12_4_ + auVar22._12_4_;
  fVar117 = auVar149._16_4_ + auVar22._16_4_;
  fVar118 = auVar149._20_4_ + auVar22._20_4_;
  fVar119 = auVar149._24_4_ + auVar22._24_4_;
  auVar29._4_4_ = fVar280 * auVar205._4_4_;
  auVar29._0_4_ = fVar279 * auVar205._0_4_;
  auVar29._8_4_ = fVar281 * auVar205._8_4_;
  auVar29._12_4_ = fVar191 * auVar205._12_4_;
  auVar29._16_4_ = fVar206 * auVar205._16_4_;
  auVar29._20_4_ = fVar207 * auVar205._20_4_;
  auVar29._24_4_ = fVar208 * auVar205._24_4_;
  auVar29._28_4_ = auVar22._28_4_;
  auVar30._4_4_ = fVar237 * local_220._4_4_;
  auVar30._0_4_ = fVar210 * local_220._0_4_;
  auVar30._8_4_ = fVar239 * local_220._8_4_;
  auVar30._12_4_ = fVar241 * local_220._12_4_;
  auVar30._16_4_ = fVar117 * local_220._16_4_;
  auVar30._20_4_ = fVar118 * local_220._20_4_;
  auVar30._24_4_ = fVar119 * local_220._24_4_;
  auVar30._28_4_ = fVar340;
  auVar29 = vsubps_avx(auVar29,auVar30);
  local_260 = local_220._0_4_ + local_260;
  fStack_25c = local_220._4_4_ + fStack_25c;
  fStack_258 = local_220._8_4_ + fStack_258;
  fStack_254 = local_220._12_4_ + fStack_254;
  fStack_250 = local_220._16_4_ + fStack_250;
  fStack_24c = local_220._20_4_ + fStack_24c;
  fStack_248 = local_220._24_4_ + fStack_248;
  fStack_244 = local_220._28_4_ + auVar23._28_4_;
  local_280 = local_280 + auVar205._0_4_;
  fStack_27c = fStack_27c + auVar205._4_4_;
  fStack_278 = fStack_278 + auVar205._8_4_;
  fStack_274 = fStack_274 + auVar205._12_4_;
  fStack_270 = fStack_270 + auVar205._16_4_;
  fStack_26c = fStack_26c + auVar205._20_4_;
  fStack_268 = fStack_268 + auVar205._24_4_;
  fStack_264 = fVar343 + auVar205._28_4_;
  auVar23._4_4_ = fVar280 * fStack_27c;
  auVar23._0_4_ = fVar279 * local_280;
  auVar23._8_4_ = fVar281 * fStack_278;
  auVar23._12_4_ = fVar191 * fStack_274;
  auVar23._16_4_ = fVar206 * fStack_270;
  auVar23._20_4_ = fVar207 * fStack_26c;
  auVar23._24_4_ = fVar208 * fStack_268;
  auVar23._28_4_ = fVar343;
  auVar31._4_4_ = fVar237 * fStack_25c;
  auVar31._0_4_ = fVar210 * local_260;
  auVar31._8_4_ = fVar239 * fStack_258;
  auVar31._12_4_ = fVar241 * fStack_254;
  auVar31._16_4_ = fVar117 * fStack_250;
  auVar31._20_4_ = fVar118 * fStack_24c;
  auVar31._24_4_ = fVar119 * fStack_248;
  auVar31._28_4_ = fVar343 + auVar205._28_4_;
  auVar23 = vsubps_avx(auVar23,auVar31);
  local_6c0 = auVar25._0_4_;
  fStack_6bc = auVar25._4_4_;
  fStack_6b8 = auVar25._8_4_;
  fStack_6b4 = auVar25._12_4_;
  fStack_6b0 = auVar25._16_4_;
  fStack_6ac = auVar25._20_4_;
  fStack_6a8 = auVar25._24_4_;
  auVar32._4_4_ = fVar280 * fStack_6bc;
  auVar32._0_4_ = fVar279 * local_6c0;
  auVar32._8_4_ = fVar281 * fStack_6b8;
  auVar32._12_4_ = fVar191 * fStack_6b4;
  auVar32._16_4_ = fVar206 * fStack_6b0;
  auVar32._20_4_ = fVar207 * fStack_6ac;
  auVar32._24_4_ = fVar208 * fStack_6a8;
  auVar32._28_4_ = fVar343;
  local_700._0_4_ = auVar110._0_4_;
  local_700._4_4_ = auVar110._4_4_;
  fStack_6f8 = auVar110._8_4_;
  fStack_6f4 = auVar110._12_4_;
  fStack_6f0 = auVar110._16_4_;
  fStack_6ec = auVar110._20_4_;
  fStack_6e8 = auVar110._24_4_;
  auVar33._4_4_ = fVar237 * (float)local_700._4_4_;
  auVar33._0_4_ = fVar210 * (float)local_700._0_4_;
  auVar33._8_4_ = fVar239 * fStack_6f8;
  auVar33._12_4_ = fVar241 * fStack_6f4;
  auVar33._16_4_ = fVar117 * fStack_6f0;
  auVar33._20_4_ = fVar118 * fStack_6ec;
  auVar33._24_4_ = fVar119 * fStack_6e8;
  auVar33._28_4_ = local_220._28_4_;
  auVar30 = vsubps_avx(auVar32,auVar33);
  auVar34._4_4_ = local_240._4_4_ * fVar280;
  auVar34._0_4_ = local_240._0_4_ * fVar279;
  auVar34._8_4_ = local_240._8_4_ * fVar281;
  auVar34._12_4_ = local_240._12_4_ * fVar191;
  auVar34._16_4_ = local_240._16_4_ * fVar206;
  auVar34._20_4_ = local_240._20_4_ * fVar207;
  auVar34._24_4_ = local_240._24_4_ * fVar208;
  auVar34._28_4_ = fVar343;
  auVar35._4_4_ = auVar111._4_4_ * fVar237;
  auVar35._0_4_ = auVar111._0_4_ * fVar210;
  auVar35._8_4_ = auVar111._8_4_ * fVar239;
  auVar35._12_4_ = auVar111._12_4_ * fVar241;
  auVar35._16_4_ = auVar111._16_4_ * fVar117;
  auVar35._20_4_ = auVar111._20_4_ * fVar118;
  auVar35._24_4_ = auVar111._24_4_ * fVar119;
  auVar35._28_4_ = local_240._28_4_;
  local_620 = auVar24._0_4_;
  fStack_61c = auVar24._4_4_;
  fStack_618 = auVar24._8_4_;
  fStack_614 = auVar24._12_4_;
  fStack_610 = auVar24._16_4_;
  fStack_60c = auVar24._20_4_;
  fStack_608 = auVar24._24_4_;
  auVar31 = vsubps_avx(auVar34,auVar35);
  auVar36._4_4_ = auVar305._4_4_ * fVar280;
  auVar36._0_4_ = auVar305._0_4_ * fVar279;
  auVar36._8_4_ = auVar305._8_4_ * fVar281;
  auVar36._12_4_ = auVar305._12_4_ * fVar191;
  auVar36._16_4_ = auVar305._16_4_ * fVar206;
  auVar36._20_4_ = auVar305._20_4_ * fVar207;
  auVar36._24_4_ = auVar305._24_4_ * fVar208;
  auVar36._28_4_ = fVar343;
  auVar37._4_4_ = fVar237 * auVar278._4_4_;
  auVar37._0_4_ = fVar210 * auVar278._0_4_;
  auVar37._8_4_ = fVar239 * auVar278._8_4_;
  auVar37._12_4_ = fVar241 * auVar278._12_4_;
  auVar37._16_4_ = fVar117 * auVar278._16_4_;
  auVar37._20_4_ = fVar118 * auVar278._20_4_;
  auVar37._24_4_ = fVar119 * auVar278._24_4_;
  auVar37._28_4_ = fStack_244;
  auVar32 = vsubps_avx(auVar36,auVar37);
  local_2a0 = auVar278._0_4_ + local_2a0;
  fStack_29c = auVar278._4_4_ + fStack_29c;
  fStack_298 = auVar278._8_4_ + fStack_298;
  fStack_294 = auVar278._12_4_ + fStack_294;
  fStack_290 = auVar278._16_4_ + fStack_290;
  fStack_28c = auVar278._20_4_ + fStack_28c;
  fStack_288 = auVar278._24_4_ + fStack_288;
  fStack_284 = auVar278._28_4_ + auVar26._28_4_;
  local_2c0 = auVar305._0_4_ + local_2c0;
  fStack_2bc = auVar305._4_4_ + fStack_2bc;
  fStack_2b8 = auVar305._8_4_ + fStack_2b8;
  fStack_2b4 = auVar305._12_4_ + fStack_2b4;
  fStack_2b0 = auVar305._16_4_ + fStack_2b0;
  fStack_2ac = auVar305._20_4_ + fStack_2ac;
  fStack_2a8 = auVar305._24_4_ + fStack_2a8;
  fStack_2a4 = auVar305._28_4_ + auVar258._28_4_;
  auVar26._4_4_ = fVar280 * fStack_2bc;
  auVar26._0_4_ = fVar279 * local_2c0;
  auVar26._8_4_ = fVar281 * fStack_2b8;
  auVar26._12_4_ = fVar191 * fStack_2b4;
  auVar26._16_4_ = fVar206 * fStack_2b0;
  auVar26._20_4_ = fVar207 * fStack_2ac;
  auVar26._24_4_ = fVar208 * fStack_2a8;
  auVar26._28_4_ = auVar305._28_4_ + auVar258._28_4_;
  auVar38._4_4_ = fStack_29c * fVar237;
  auVar38._0_4_ = local_2a0 * fVar210;
  auVar38._8_4_ = fStack_298 * fVar239;
  auVar38._12_4_ = fStack_294 * fVar241;
  auVar38._16_4_ = fStack_290 * fVar117;
  auVar38._20_4_ = fStack_28c * fVar118;
  auVar38._24_4_ = fStack_288 * fVar119;
  auVar38._28_4_ = fStack_284;
  auVar26 = vsubps_avx(auVar26,auVar38);
  auVar39._4_4_ = fVar280 * local_200._4_4_;
  auVar39._0_4_ = fVar279 * local_200._0_4_;
  auVar39._8_4_ = fVar281 * local_200._8_4_;
  auVar39._12_4_ = fVar191 * local_200._12_4_;
  auVar39._16_4_ = fVar206 * local_200._16_4_;
  auVar39._20_4_ = fVar207 * local_200._20_4_;
  auVar39._24_4_ = fVar208 * local_200._24_4_;
  auVar39._28_4_ = fStack_284;
  auVar40._4_4_ = fVar237 * fStack_61c;
  auVar40._0_4_ = fVar210 * local_620;
  auVar40._8_4_ = fVar239 * fStack_618;
  auVar40._12_4_ = fVar241 * fStack_614;
  auVar40._16_4_ = fVar117 * fStack_610;
  auVar40._20_4_ = fVar118 * fStack_60c;
  auVar40._24_4_ = fVar119 * fStack_608;
  auVar40._28_4_ = local_200._28_4_;
  auVar33 = vsubps_avx(auVar39,auVar40);
  auVar41._4_4_ = fVar280 * auVar27._4_4_;
  auVar41._0_4_ = fVar279 * auVar27._0_4_;
  auVar41._8_4_ = fVar281 * auVar27._8_4_;
  auVar41._12_4_ = fVar191 * auVar27._12_4_;
  auVar41._16_4_ = fVar206 * auVar27._16_4_;
  auVar41._20_4_ = fVar207 * auVar27._20_4_;
  auVar41._24_4_ = fVar208 * auVar27._24_4_;
  auVar41._28_4_ = auVar113._28_4_ + auVar28._28_4_;
  auVar28._4_4_ = auVar112._4_4_ * fVar237;
  auVar28._0_4_ = auVar112._0_4_ * fVar210;
  auVar28._8_4_ = auVar112._8_4_ * fVar239;
  auVar28._12_4_ = auVar112._12_4_ * fVar241;
  auVar28._16_4_ = auVar112._16_4_ * fVar117;
  auVar28._20_4_ = auVar112._20_4_ * fVar118;
  auVar28._24_4_ = auVar112._24_4_ * fVar119;
  auVar28._28_4_ = auVar149._28_4_ + auVar22._28_4_;
  auVar28 = vsubps_avx(auVar41,auVar28);
  auVar24 = vminps_avx(auVar29,auVar23);
  auVar110 = vmaxps_avx(auVar29,auVar23);
  auVar25 = vminps_avx(auVar30,auVar31);
  auVar25 = vminps_avx(auVar24,auVar25);
  auVar24 = vmaxps_avx(auVar30,auVar31);
  auVar110 = vmaxps_avx(auVar110,auVar24);
  auVar22 = vminps_avx(auVar32,auVar26);
  auVar24 = vmaxps_avx(auVar32,auVar26);
  auVar23 = vminps_avx(auVar33,auVar28);
  auVar23 = vminps_avx(auVar22,auVar23);
  auVar23 = vminps_avx(auVar25,auVar23);
  auVar25 = vmaxps_avx(auVar33,auVar28);
  auVar24 = vmaxps_avx(auVar24,auVar25);
  auVar24 = vmaxps_avx(auVar110,auVar24);
  auVar110 = vcmpps_avx(auVar23,local_1c0,2);
  auVar24 = vcmpps_avx(auVar24,local_1e0,5);
  auVar110 = vandps_avx(auVar24,auVar110);
  auVar24 = local_2e0 & auVar110;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar24 = vsubps_avx(auVar111,local_220);
    auVar25 = vsubps_avx(auVar112,auVar278);
    fVar280 = auVar24._0_4_ + auVar25._0_4_;
    fVar281 = auVar24._4_4_ + auVar25._4_4_;
    fVar191 = auVar24._8_4_ + auVar25._8_4_;
    fVar206 = auVar24._12_4_ + auVar25._12_4_;
    fVar207 = auVar24._16_4_ + auVar25._16_4_;
    fVar208 = auVar24._20_4_ + auVar25._20_4_;
    fVar210 = auVar24._24_4_ + auVar25._24_4_;
    auVar23 = vsubps_avx(local_240,auVar205);
    auVar26 = vsubps_avx(auVar27,auVar305);
    fVar237 = auVar23._0_4_ + auVar26._0_4_;
    fVar239 = auVar23._4_4_ + auVar26._4_4_;
    fVar241 = auVar23._8_4_ + auVar26._8_4_;
    fVar117 = auVar23._12_4_ + auVar26._12_4_;
    fVar118 = auVar23._16_4_ + auVar26._16_4_;
    fVar119 = auVar23._20_4_ + auVar26._20_4_;
    fVar299 = auVar23._24_4_ + auVar26._24_4_;
    fVar279 = auVar26._28_4_;
    auVar42._4_4_ = auVar205._4_4_ * fVar281;
    auVar42._0_4_ = auVar205._0_4_ * fVar280;
    auVar42._8_4_ = auVar205._8_4_ * fVar191;
    auVar42._12_4_ = auVar205._12_4_ * fVar206;
    auVar42._16_4_ = auVar205._16_4_ * fVar207;
    auVar42._20_4_ = auVar205._20_4_ * fVar208;
    auVar42._24_4_ = auVar205._24_4_ * fVar210;
    auVar42._28_4_ = auVar205._28_4_;
    auVar43._4_4_ = local_220._4_4_ * fVar239;
    auVar43._0_4_ = local_220._0_4_ * fVar237;
    auVar43._8_4_ = local_220._8_4_ * fVar241;
    auVar43._12_4_ = local_220._12_4_ * fVar117;
    auVar43._16_4_ = local_220._16_4_ * fVar118;
    auVar43._20_4_ = local_220._20_4_ * fVar119;
    auVar43._24_4_ = local_220._24_4_ * fVar299;
    auVar43._28_4_ = local_220._28_4_;
    auVar26 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = fVar281 * fStack_27c;
    auVar44._0_4_ = fVar280 * local_280;
    auVar44._8_4_ = fVar191 * fStack_278;
    auVar44._12_4_ = fVar206 * fStack_274;
    auVar44._16_4_ = fVar207 * fStack_270;
    auVar44._20_4_ = fVar208 * fStack_26c;
    auVar44._24_4_ = fVar210 * fStack_268;
    auVar44._28_4_ = auVar205._28_4_;
    auVar45._4_4_ = fVar239 * fStack_25c;
    auVar45._0_4_ = fVar237 * local_260;
    auVar45._8_4_ = fVar241 * fStack_258;
    auVar45._12_4_ = fVar117 * fStack_254;
    auVar45._16_4_ = fVar118 * fStack_250;
    auVar45._20_4_ = fVar119 * fStack_24c;
    auVar45._24_4_ = fVar299 * fStack_248;
    auVar45._28_4_ = fVar279;
    auVar28 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar281 * fStack_6bc;
    auVar46._0_4_ = fVar280 * local_6c0;
    auVar46._8_4_ = fVar191 * fStack_6b8;
    auVar46._12_4_ = fVar206 * fStack_6b4;
    auVar46._16_4_ = fVar207 * fStack_6b0;
    auVar46._20_4_ = fVar208 * fStack_6ac;
    auVar46._24_4_ = fVar210 * fStack_6a8;
    auVar46._28_4_ = fVar279;
    auVar47._4_4_ = fVar239 * (float)local_700._4_4_;
    auVar47._0_4_ = fVar237 * (float)local_700._0_4_;
    auVar47._8_4_ = fVar241 * fStack_6f8;
    auVar47._12_4_ = fVar117 * fStack_6f4;
    auVar47._16_4_ = fVar118 * fStack_6f0;
    auVar47._20_4_ = fVar119 * fStack_6ec;
    auVar47._24_4_ = fVar299 * fStack_6e8;
    auVar47._28_4_ = auVar22._28_4_;
    auVar113 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = local_240._4_4_ * fVar281;
    auVar48._0_4_ = local_240._0_4_ * fVar280;
    auVar48._8_4_ = local_240._8_4_ * fVar191;
    auVar48._12_4_ = local_240._12_4_ * fVar206;
    auVar48._16_4_ = local_240._16_4_ * fVar207;
    auVar48._20_4_ = local_240._20_4_ * fVar208;
    auVar48._24_4_ = local_240._24_4_ * fVar210;
    auVar48._28_4_ = auVar22._28_4_;
    auVar49._4_4_ = auVar111._4_4_ * fVar239;
    auVar49._0_4_ = auVar111._0_4_ * fVar237;
    auVar49._8_4_ = auVar111._8_4_ * fVar241;
    auVar49._12_4_ = auVar111._12_4_ * fVar117;
    auVar49._16_4_ = auVar111._16_4_ * fVar118;
    auVar49._20_4_ = auVar111._20_4_ * fVar119;
    uVar76 = auVar111._28_4_;
    auVar49._24_4_ = auVar111._24_4_ * fVar299;
    auVar49._28_4_ = uVar76;
    auVar111 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = auVar305._4_4_ * fVar281;
    auVar50._0_4_ = auVar305._0_4_ * fVar280;
    auVar50._8_4_ = auVar305._8_4_ * fVar191;
    auVar50._12_4_ = auVar305._12_4_ * fVar206;
    auVar50._16_4_ = auVar305._16_4_ * fVar207;
    auVar50._20_4_ = auVar305._20_4_ * fVar208;
    auVar50._24_4_ = auVar305._24_4_ * fVar210;
    auVar50._28_4_ = uVar76;
    auVar51._4_4_ = auVar278._4_4_ * fVar239;
    auVar51._0_4_ = auVar278._0_4_ * fVar237;
    auVar51._8_4_ = auVar278._8_4_ * fVar241;
    auVar51._12_4_ = auVar278._12_4_ * fVar117;
    auVar51._16_4_ = auVar278._16_4_ * fVar118;
    auVar51._20_4_ = auVar278._20_4_ * fVar119;
    auVar51._24_4_ = auVar278._24_4_ * fVar299;
    auVar51._28_4_ = auVar278._28_4_;
    auVar149 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = fVar281 * fStack_2bc;
    auVar52._0_4_ = fVar280 * local_2c0;
    auVar52._8_4_ = fVar191 * fStack_2b8;
    auVar52._12_4_ = fVar206 * fStack_2b4;
    auVar52._16_4_ = fVar207 * fStack_2b0;
    auVar52._20_4_ = fVar208 * fStack_2ac;
    auVar52._24_4_ = fVar210 * fStack_2a8;
    auVar52._28_4_ = uVar76;
    auVar53._4_4_ = fVar239 * fStack_29c;
    auVar53._0_4_ = fVar237 * local_2a0;
    auVar53._8_4_ = fVar241 * fStack_298;
    auVar53._12_4_ = fVar117 * fStack_294;
    auVar53._16_4_ = fVar118 * fStack_290;
    auVar53._20_4_ = fVar119 * fStack_28c;
    auVar53._24_4_ = fVar299 * fStack_288;
    auVar53._28_4_ = auVar305._28_4_;
    auVar29 = vsubps_avx(auVar52,auVar53);
    auVar54._4_4_ = fVar281 * local_200._4_4_;
    auVar54._0_4_ = fVar280 * local_200._0_4_;
    auVar54._8_4_ = fVar191 * local_200._8_4_;
    auVar54._12_4_ = fVar206 * local_200._12_4_;
    auVar54._16_4_ = fVar207 * local_200._16_4_;
    auVar54._20_4_ = fVar208 * local_200._20_4_;
    auVar54._24_4_ = fVar210 * local_200._24_4_;
    auVar54._28_4_ = auVar305._28_4_;
    auVar55._4_4_ = fStack_61c * fVar239;
    auVar55._0_4_ = local_620 * fVar237;
    auVar55._8_4_ = fStack_618 * fVar241;
    auVar55._12_4_ = fStack_614 * fVar117;
    auVar55._16_4_ = fStack_610 * fVar118;
    auVar55._20_4_ = fStack_60c * fVar119;
    auVar55._24_4_ = fStack_608 * fVar299;
    auVar55._28_4_ = local_240._28_4_;
    auVar30 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = fVar281 * auVar27._4_4_;
    auVar56._0_4_ = fVar280 * auVar27._0_4_;
    auVar56._8_4_ = fVar191 * auVar27._8_4_;
    auVar56._12_4_ = fVar206 * auVar27._12_4_;
    auVar56._16_4_ = fVar207 * auVar27._16_4_;
    auVar56._20_4_ = fVar208 * auVar27._20_4_;
    auVar56._24_4_ = fVar210 * auVar27._24_4_;
    auVar56._28_4_ = auVar24._28_4_ + auVar25._28_4_;
    auVar57._4_4_ = auVar112._4_4_ * fVar239;
    auVar57._0_4_ = auVar112._0_4_ * fVar237;
    auVar57._8_4_ = auVar112._8_4_ * fVar241;
    auVar57._12_4_ = auVar112._12_4_ * fVar117;
    auVar57._16_4_ = auVar112._16_4_ * fVar118;
    auVar57._20_4_ = auVar112._20_4_ * fVar119;
    auVar57._24_4_ = auVar112._24_4_ * fVar299;
    auVar57._28_4_ = auVar23._28_4_ + fVar279;
    auVar112 = vsubps_avx(auVar56,auVar57);
    auVar25 = vminps_avx(auVar26,auVar28);
    auVar24 = vmaxps_avx(auVar26,auVar28);
    auVar22 = vminps_avx(auVar113,auVar111);
    auVar22 = vminps_avx(auVar25,auVar22);
    auVar25 = vmaxps_avx(auVar113,auVar111);
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar23 = vminps_avx(auVar149,auVar29);
    auVar25 = vmaxps_avx(auVar149,auVar29);
    auVar111 = vminps_avx(auVar30,auVar112);
    auVar23 = vminps_avx(auVar23,auVar111);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar30,auVar112);
    auVar25 = vmaxps_avx(auVar25,auVar22);
    auVar25 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vcmpps_avx(auVar23,local_1c0,2);
    auVar25 = vcmpps_avx(auVar25,local_1e0,5);
    auVar24 = vandps_avx(auVar25,auVar24);
    auVar110 = vandps_avx(local_2e0,auVar110);
    auVar25 = auVar110 & auVar24;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar110 = vandps_avx(auVar24,auVar110);
      uVar66 = vmovmskps_avx(auVar110);
      if (uVar66 != 0) {
        auStack_4c0[uVar71] = uVar66 & 0xff;
        uVar9 = vmovlps_avx(local_420);
        *(undefined8 *)(afStack_340 + uVar71 * 2) = uVar9;
        uVar10 = vmovlps_avx(auVar81);
        auStack_1a0[uVar71] = uVar10;
        uVar71 = (ulong)((int)uVar71 + 1);
      }
    }
  }
LAB_008c0503:
  do {
    do {
      do {
        do {
          if ((int)uVar71 == 0) {
            auVar59 = ZEXT812(0) << 0x20;
            if (bVar77) goto LAB_008c1586;
            uVar76 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar109._4_4_ = uVar76;
            auVar109._0_4_ = uVar76;
            auVar109._8_4_ = uVar76;
            auVar109._12_4_ = uVar76;
            auVar92 = vcmpps_avx(local_430,auVar109,2);
            uVar67 = vmovmskps_avx(auVar92);
            uVar68 = (ulong)((uint)uVar68 & (uint)uVar68 + 0xf & uVar67);
            goto LAB_008bf28a;
          }
          uVar69 = (int)uVar71 - 1;
          uVar72 = (ulong)uVar69;
          uVar66 = auStack_4c0[uVar72];
          fVar279 = afStack_340[uVar72 * 2];
          fVar280 = afStack_340[uVar72 * 2 + 1];
          auVar325._8_8_ = 0;
          auVar325._0_8_ = auStack_1a0[uVar72];
          auVar330 = ZEXT1664(auVar325);
          uVar10 = 0;
          if (uVar66 != 0) {
            for (; (uVar66 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar66 = uVar66 - 1 & uVar66;
          auStack_4c0[uVar72] = uVar66;
          if (uVar66 == 0) {
            uVar71 = (ulong)uVar69;
          }
          fVar191 = (float)(uVar10 + 1) * 0.14285715;
          fVar281 = (1.0 - (float)uVar10 * 0.14285715) * fVar279 +
                    fVar280 * (float)uVar10 * 0.14285715;
          fVar279 = (1.0 - fVar191) * fVar279 + fVar280 * fVar191;
          fVar280 = fVar279 - fVar281;
          if (0.16666667 <= fVar280) {
            auVar92 = vinsertps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar279),0x10);
            auVar363 = ZEXT1664(auVar92);
            goto LAB_008bfe9d;
          }
          auVar92 = vshufps_avx(auVar325,auVar325,0x50);
          auVar130._8_4_ = 0x3f800000;
          auVar130._0_8_ = 0x3f8000003f800000;
          auVar130._12_4_ = 0x3f800000;
          auVar126 = vsubps_avx(auVar130,auVar92);
          fVar191 = auVar92._0_4_;
          fVar206 = auVar92._4_4_;
          fVar207 = auVar92._8_4_;
          fVar208 = auVar92._12_4_;
          fVar210 = auVar126._0_4_;
          fVar237 = auVar126._4_4_;
          fVar239 = auVar126._8_4_;
          fVar241 = auVar126._12_4_;
          auVar170._0_4_ = fVar191 * auVar292._0_4_ + fVar210 * (float)local_710._0_4_;
          auVar170._4_4_ = fVar206 * auVar292._4_4_ + fVar237 * (float)local_710._4_4_;
          auVar170._8_4_ = fVar207 * auVar292._0_4_ + fVar239 * (float)local_710._0_4_;
          auVar170._12_4_ = fVar208 * auVar292._4_4_ + fVar241 * (float)local_710._4_4_;
          auVar226._0_4_ = auVar301._0_4_ * fVar191 + fVar211 * fVar210;
          auVar226._4_4_ = auVar301._4_4_ * fVar206 + fVar240 * fVar237;
          auVar226._8_4_ = auVar301._0_4_ * fVar207 + fVar211 * fVar239;
          auVar226._12_4_ = auVar301._4_4_ * fVar208 + fVar240 * fVar241;
          auVar251._0_4_ = auVar314._0_4_ * fVar191 + auVar200._0_4_ * fVar210;
          auVar251._4_4_ = auVar314._4_4_ * fVar206 + auVar200._4_4_ * fVar237;
          auVar251._8_4_ = auVar314._0_4_ * fVar207 + auVar200._0_4_ * fVar239;
          auVar251._12_4_ = auVar314._4_4_ * fVar208 + auVar200._4_4_ * fVar241;
          auVar96._0_4_ = auVar94._0_4_ * fVar191 + auVar129._0_4_ * fVar210;
          auVar96._4_4_ = auVar94._4_4_ * fVar206 + auVar129._4_4_ * fVar237;
          auVar96._8_4_ = auVar94._0_4_ * fVar207 + auVar129._0_4_ * fVar239;
          auVar96._12_4_ = auVar94._4_4_ * fVar208 + auVar129._4_4_ * fVar241;
          auVar150._16_16_ = auVar170;
          auVar150._0_16_ = auVar170;
          auVar188._16_16_ = auVar226;
          auVar188._0_16_ = auVar226;
          auVar236._16_16_ = auVar251;
          auVar236._0_16_ = auVar251;
          auVar110 = ZEXT2032(CONCAT416(fVar279,ZEXT416((uint)fVar281)));
          auVar110 = vshufps_avx(auVar110,auVar110,0);
          auVar24 = vsubps_avx(auVar188,auVar150);
          fVar191 = auVar110._0_4_;
          fVar206 = auVar110._4_4_;
          fVar207 = auVar110._8_4_;
          fVar208 = auVar110._12_4_;
          fVar210 = auVar110._16_4_;
          fVar237 = auVar110._20_4_;
          fVar239 = auVar110._24_4_;
          auVar151._0_4_ = auVar170._0_4_ + auVar24._0_4_ * fVar191;
          auVar151._4_4_ = auVar170._4_4_ + auVar24._4_4_ * fVar206;
          auVar151._8_4_ = auVar170._8_4_ + auVar24._8_4_ * fVar207;
          auVar151._12_4_ = auVar170._12_4_ + auVar24._12_4_ * fVar208;
          auVar151._16_4_ = auVar170._0_4_ + auVar24._16_4_ * fVar210;
          auVar151._20_4_ = auVar170._4_4_ + auVar24._20_4_ * fVar237;
          auVar151._24_4_ = auVar170._8_4_ + auVar24._24_4_ * fVar239;
          auVar151._28_4_ = auVar170._12_4_ + auVar24._28_4_;
          auVar110 = vsubps_avx(auVar236,auVar188);
          auVar189._0_4_ = auVar226._0_4_ + auVar110._0_4_ * fVar191;
          auVar189._4_4_ = auVar226._4_4_ + auVar110._4_4_ * fVar206;
          auVar189._8_4_ = auVar226._8_4_ + auVar110._8_4_ * fVar207;
          auVar189._12_4_ = auVar226._12_4_ + auVar110._12_4_ * fVar208;
          auVar189._16_4_ = auVar226._0_4_ + auVar110._16_4_ * fVar210;
          auVar189._20_4_ = auVar226._4_4_ + auVar110._20_4_ * fVar237;
          auVar189._24_4_ = auVar226._8_4_ + auVar110._24_4_ * fVar239;
          auVar189._28_4_ = auVar226._12_4_ + auVar110._28_4_;
          auVar92 = vsubps_avx(auVar96,auVar251);
          auVar114._0_4_ = auVar251._0_4_ + auVar92._0_4_ * fVar191;
          auVar114._4_4_ = auVar251._4_4_ + auVar92._4_4_ * fVar206;
          auVar114._8_4_ = auVar251._8_4_ + auVar92._8_4_ * fVar207;
          auVar114._12_4_ = auVar251._12_4_ + auVar92._12_4_ * fVar208;
          auVar114._16_4_ = auVar251._0_4_ + auVar92._0_4_ * fVar210;
          auVar114._20_4_ = auVar251._4_4_ + auVar92._4_4_ * fVar237;
          auVar114._24_4_ = auVar251._8_4_ + auVar92._8_4_ * fVar239;
          auVar114._28_4_ = auVar251._12_4_ + auVar92._12_4_;
          auVar110 = vsubps_avx(auVar189,auVar151);
          auVar152._0_4_ = auVar151._0_4_ + fVar191 * auVar110._0_4_;
          auVar152._4_4_ = auVar151._4_4_ + fVar206 * auVar110._4_4_;
          auVar152._8_4_ = auVar151._8_4_ + fVar207 * auVar110._8_4_;
          auVar152._12_4_ = auVar151._12_4_ + fVar208 * auVar110._12_4_;
          auVar152._16_4_ = auVar151._16_4_ + fVar210 * auVar110._16_4_;
          auVar152._20_4_ = auVar151._20_4_ + fVar237 * auVar110._20_4_;
          auVar152._24_4_ = auVar151._24_4_ + fVar239 * auVar110._24_4_;
          auVar152._28_4_ = auVar151._28_4_ + auVar110._28_4_;
          auVar110 = vsubps_avx(auVar114,auVar189);
          auVar115._0_4_ = auVar189._0_4_ + fVar191 * auVar110._0_4_;
          auVar115._4_4_ = auVar189._4_4_ + fVar206 * auVar110._4_4_;
          auVar115._8_4_ = auVar189._8_4_ + fVar207 * auVar110._8_4_;
          auVar115._12_4_ = auVar189._12_4_ + fVar208 * auVar110._12_4_;
          auVar115._16_4_ = auVar189._16_4_ + fVar210 * auVar110._16_4_;
          auVar115._20_4_ = auVar189._20_4_ + fVar237 * auVar110._20_4_;
          auVar115._24_4_ = auVar189._24_4_ + fVar239 * auVar110._24_4_;
          auVar115._28_4_ = auVar189._28_4_ + auVar110._28_4_;
          auVar110 = vsubps_avx(auVar115,auVar152);
          auVar263._0_4_ = auVar152._0_4_ + fVar191 * auVar110._0_4_;
          auVar263._4_4_ = auVar152._4_4_ + fVar206 * auVar110._4_4_;
          auVar263._8_4_ = auVar152._8_4_ + fVar207 * auVar110._8_4_;
          auVar263._12_4_ = auVar152._12_4_ + fVar208 * auVar110._12_4_;
          auVar267._16_4_ = auVar152._16_4_ + fVar210 * auVar110._16_4_;
          auVar267._0_16_ = auVar263;
          auVar267._20_4_ = auVar152._20_4_ + fVar237 * auVar110._20_4_;
          auVar267._24_4_ = auVar152._24_4_ + fVar239 * auVar110._24_4_;
          auVar267._28_4_ = auVar152._28_4_ + auVar189._28_4_;
          auVar268 = auVar267._16_16_;
          auVar132 = vshufps_avx(ZEXT416((uint)(fVar280 * 0.33333334)),
                                 ZEXT416((uint)(fVar280 * 0.33333334)),0);
          auVar227._0_4_ = auVar263._0_4_ + auVar132._0_4_ * auVar110._0_4_ * 3.0;
          auVar227._4_4_ = auVar263._4_4_ + auVar132._4_4_ * auVar110._4_4_ * 3.0;
          auVar227._8_4_ = auVar263._8_4_ + auVar132._8_4_ * auVar110._8_4_ * 3.0;
          auVar227._12_4_ = auVar263._12_4_ + auVar132._12_4_ * auVar110._12_4_ * 3.0;
          auVar186 = vshufpd_avx(auVar263,auVar263,3);
          auVar144 = vshufpd_avx(auVar268,auVar268,3);
          auVar92 = vsubps_avx(auVar186,auVar263);
          auVar126 = vsubps_avx(auVar144,auVar268);
          auVar97._0_4_ = auVar92._0_4_ + auVar126._0_4_;
          auVar97._4_4_ = auVar92._4_4_ + auVar126._4_4_;
          auVar97._8_4_ = auVar92._8_4_ + auVar126._8_4_;
          auVar97._12_4_ = auVar92._12_4_ + auVar126._12_4_;
          auVar92 = vmovshdup_avx(auVar263);
          auVar126 = vmovshdup_avx(auVar227);
          auVar172 = vshufps_avx(auVar97,auVar97,0);
          auVar133 = vshufps_avx(auVar97,auVar97,0x55);
          fVar191 = auVar133._0_4_;
          fVar206 = auVar133._4_4_;
          fVar207 = auVar133._8_4_;
          fVar208 = auVar133._12_4_;
          fVar210 = auVar172._0_4_;
          fVar237 = auVar172._4_4_;
          fVar239 = auVar172._8_4_;
          fVar241 = auVar172._12_4_;
          auVar98._0_4_ = fVar210 * auVar263._0_4_ + auVar92._0_4_ * fVar191;
          auVar98._4_4_ = fVar237 * auVar263._4_4_ + auVar92._4_4_ * fVar206;
          auVar98._8_4_ = fVar239 * auVar263._8_4_ + auVar92._8_4_ * fVar207;
          auVar98._12_4_ = fVar241 * auVar263._12_4_ + auVar92._12_4_ * fVar208;
          auVar326._0_4_ = fVar210 * auVar227._0_4_ + auVar126._0_4_ * fVar191;
          auVar326._4_4_ = fVar237 * auVar227._4_4_ + auVar126._4_4_ * fVar206;
          auVar326._8_4_ = fVar239 * auVar227._8_4_ + auVar126._8_4_ * fVar207;
          auVar326._12_4_ = fVar241 * auVar227._12_4_ + auVar126._12_4_ * fVar208;
          auVar126 = vshufps_avx(auVar98,auVar98,0xe8);
          auVar172 = vshufps_avx(auVar326,auVar326,0xe8);
          auVar92 = vcmpps_avx(auVar126,auVar172,1);
          uVar66 = vextractps_avx(auVar92,0);
          auVar133 = auVar326;
          if ((uVar66 & 1) == 0) {
            auVar133 = auVar98;
          }
          auVar131._0_4_ = auVar132._0_4_ * auVar110._16_4_ * 3.0;
          auVar131._4_4_ = auVar132._4_4_ * auVar110._20_4_ * 3.0;
          auVar131._8_4_ = auVar132._8_4_ * auVar110._24_4_ * 3.0;
          auVar131._12_4_ = auVar132._12_4_ * 0.0;
          auVar80 = vsubps_avx(auVar268,auVar131);
          auVar132 = vmovshdup_avx(auVar80);
          auVar268 = vmovshdup_avx(auVar268);
          fVar117 = auVar80._0_4_;
          fVar118 = auVar80._4_4_;
          auVar252._0_4_ = fVar117 * fVar210 + auVar132._0_4_ * fVar191;
          auVar252._4_4_ = fVar118 * fVar237 + auVar132._4_4_ * fVar206;
          auVar252._8_4_ = auVar80._8_4_ * fVar239 + auVar132._8_4_ * fVar207;
          auVar252._12_4_ = auVar80._12_4_ * fVar241 + auVar132._12_4_ * fVar208;
          auVar362._0_4_ = fVar210 * auVar267._16_4_ + auVar268._0_4_ * fVar191;
          auVar362._4_4_ = fVar237 * auVar267._20_4_ + auVar268._4_4_ * fVar206;
          auVar362._8_4_ = fVar239 * auVar267._24_4_ + auVar268._8_4_ * fVar207;
          auVar362._12_4_ = fVar241 * auVar267._28_4_ + auVar268._12_4_ * fVar208;
          auVar268 = vshufps_avx(auVar252,auVar252,0xe8);
          auVar21 = vshufps_avx(auVar362,auVar362,0xe8);
          auVar132 = vcmpps_avx(auVar268,auVar21,1);
          uVar66 = vextractps_avx(auVar132,0);
          auVar81 = auVar362;
          if ((uVar66 & 1) == 0) {
            auVar81 = auVar252;
          }
          auVar133 = vmaxss_avx(auVar81,auVar133);
          auVar126 = vminps_avx(auVar126,auVar172);
          auVar172 = vminps_avx(auVar268,auVar21);
          auVar172 = vminps_avx(auVar126,auVar172);
          auVar92 = vshufps_avx(auVar92,auVar92,0x55);
          auVar92 = vblendps_avx(auVar92,auVar132,2);
          auVar132 = vpslld_avx(auVar92,0x1f);
          auVar92 = vshufpd_avx(auVar326,auVar326,1);
          auVar92 = vinsertps_avx(auVar92,auVar362,0x9c);
          auVar126 = vshufpd_avx(auVar98,auVar98,1);
          auVar126 = vinsertps_avx(auVar126,auVar252,0x9c);
          auVar92 = vblendvps_avx(auVar126,auVar92,auVar132);
          auVar126 = vmovshdup_avx(auVar92);
          auVar92 = vmaxss_avx(auVar126,auVar92);
          fVar207 = auVar172._0_4_;
          auVar126 = vmovshdup_avx(auVar172);
          fVar206 = auVar92._0_4_;
          fVar208 = auVar126._0_4_;
          fVar191 = auVar133._0_4_;
          if ((fVar207 < 0.0001) && (-0.0001 < fVar206)) break;
          if ((fVar208 < 0.0001 && -0.0001 < fVar191) || (fVar207 < 0.0001 && -0.0001 < fVar191))
          break;
          auVar132 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar92,1);
          auVar126 = vcmpps_avx(auVar126,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar126 = vandps_avx(auVar126,auVar132);
        } while ((auVar126 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
        auVar132 = vcmpps_avx(auVar172,_DAT_01f45a50,1);
        auVar126 = vcmpss_avx(auVar133,ZEXT416(0) << 0x20,1);
        auVar171._8_4_ = 0x3f800000;
        auVar171._0_8_ = 0x3f8000003f800000;
        auVar171._12_4_ = 0x3f800000;
        auVar228._8_4_ = 0xbf800000;
        auVar228._0_8_ = 0xbf800000bf800000;
        auVar228._12_4_ = 0xbf800000;
        auVar126 = vblendvps_avx(auVar171,auVar228,auVar126);
        auVar132 = vblendvps_avx(auVar171,auVar228,auVar132);
        auVar172 = vcmpss_avx(auVar132,auVar126,4);
        auVar172 = vpshufd_avx(ZEXT416(auVar172._0_4_ & 1),0x50);
        auVar172 = vpslld_avx(auVar172,0x1f);
        auVar172 = vpsrad_avx(auVar172,0x1f);
        auVar172 = vpandn_avx(auVar172,_DAT_01f7afb0);
        auVar133 = vmovshdup_avx(auVar132);
        fVar210 = auVar133._0_4_;
        if ((auVar132._0_4_ != fVar210) || (NAN(auVar132._0_4_) || NAN(fVar210))) {
          if ((fVar208 != fVar207) || (NAN(fVar208) || NAN(fVar207))) {
            fVar207 = -fVar207 / (fVar208 - fVar207);
            auVar132 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar207) * 0.0 + fVar207)));
          }
          else {
            auVar132 = ZEXT816(0x3f80000000000000);
            if ((fVar207 != 0.0) || (NAN(fVar207))) {
              auVar132 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar268 = vcmpps_avx(auVar172,auVar132,1);
          auVar133 = vblendps_avx(auVar172,auVar132,2);
          auVar132 = vblendps_avx(auVar132,auVar172,2);
          auVar172 = vblendvps_avx(auVar132,auVar133,auVar268);
        }
        auVar92 = vcmpss_avx(auVar92,ZEXT416(0) << 0x20,1);
        auVar173._8_4_ = 0x3f800000;
        auVar173._0_8_ = 0x3f8000003f800000;
        auVar173._12_4_ = 0x3f800000;
        auVar229._8_4_ = 0xbf800000;
        auVar229._0_8_ = 0xbf800000bf800000;
        auVar229._12_4_ = 0xbf800000;
        auVar92 = vblendvps_avx(auVar173,auVar229,auVar92);
        fVar207 = auVar92._0_4_;
        if ((auVar126._0_4_ != fVar207) || (NAN(auVar126._0_4_) || NAN(fVar207))) {
          if ((fVar206 != fVar191) || (NAN(fVar206) || NAN(fVar191))) {
            fVar191 = -fVar191 / (fVar206 - fVar191);
            auVar92 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar191) * 0.0 + fVar191)));
          }
          else {
            auVar92 = ZEXT816(0x3f80000000000000);
            if ((fVar191 != 0.0) || (NAN(fVar191))) {
              auVar92 = ZEXT816(0xff8000007f800000);
            }
          }
          auVar132 = vcmpps_avx(auVar172,auVar92,1);
          auVar126 = vblendps_avx(auVar172,auVar92,2);
          auVar92 = vblendps_avx(auVar92,auVar172,2);
          auVar172 = vblendvps_avx(auVar92,auVar126,auVar132);
        }
        if ((fVar210 != fVar207) || (NAN(fVar210) || NAN(fVar207))) {
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar92 = vcmpps_avx(auVar172,auVar99,1);
          auVar126 = vinsertps_avx(auVar172,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar174._4_12_ = auVar172._4_12_;
          auVar174._0_4_ = 0x3f800000;
          auVar172 = vblendvps_avx(auVar174,auVar126,auVar92);
        }
        auVar92 = vcmpps_avx(auVar172,_DAT_01f46740,1);
        auVar60._12_4_ = 0;
        auVar60._0_12_ = auVar172._4_12_;
        auVar126 = vinsertps_avx(auVar172,ZEXT416(0x3f800000),0x10);
        auVar92 = vblendvps_avx(auVar126,auVar60 << 0x20,auVar92);
        auVar126 = vmovshdup_avx(auVar92);
      } while (auVar126._0_4_ < auVar92._0_4_);
      auVar100._0_4_ = auVar92._0_4_ + -0.1;
      auVar100._4_4_ = auVar92._4_4_ + 0.1;
      auVar100._8_4_ = auVar92._8_4_ + 0.0;
      auVar100._12_4_ = auVar92._12_4_ + 0.0;
      auVar132 = vshufpd_avx(auVar227,auVar227,3);
      auVar264._8_8_ = 0x3f80000000000000;
      auVar264._0_8_ = 0x3f80000000000000;
      auVar92 = vcmpps_avx(auVar100,auVar264,1);
      auVar58._12_4_ = 0;
      auVar58._0_12_ = auVar100._4_12_;
      auVar126 = vinsertps_avx(auVar100,SUB6416(ZEXT464(0x3f800000),0),0x10);
      auVar92 = vblendvps_avx(auVar126,auVar58 << 0x20,auVar92);
      auVar126 = vshufpd_avx(auVar80,auVar80,3);
      auVar172 = vshufps_avx(auVar92,auVar92,0x50);
      auVar265._8_4_ = 0x3f800000;
      auVar265._0_8_ = 0x3f8000003f800000;
      auVar265._12_4_ = 0x3f800000;
      auVar133 = vsubps_avx(auVar265,auVar172);
      local_600 = auVar186._0_4_;
      fStack_5fc = auVar186._4_4_;
      fStack_5f8 = auVar186._8_4_;
      fStack_5f4 = auVar186._12_4_;
      fVar191 = auVar172._0_4_;
      fVar206 = auVar172._4_4_;
      fVar207 = auVar172._8_4_;
      fVar208 = auVar172._12_4_;
      local_6a0 = auVar144._0_4_;
      fStack_69c = auVar144._4_4_;
      fStack_698 = auVar144._8_4_;
      fStack_694 = auVar144._12_4_;
      fVar210 = auVar133._0_4_;
      fVar237 = auVar133._4_4_;
      fVar239 = auVar133._8_4_;
      fVar241 = auVar133._12_4_;
      auVar101._0_4_ = fVar191 * local_600 + fVar210 * auVar263._0_4_;
      auVar101._4_4_ = fVar206 * fStack_5fc + fVar237 * auVar263._4_4_;
      auVar101._8_4_ = fVar207 * fStack_5f8 + fVar239 * auVar263._0_4_;
      auVar101._12_4_ = fVar208 * fStack_5f4 + fVar241 * auVar263._4_4_;
      auVar253._0_4_ = auVar132._0_4_ * fVar191 + fVar210 * auVar227._0_4_;
      auVar253._4_4_ = auVar132._4_4_ * fVar206 + fVar237 * auVar227._4_4_;
      auVar253._8_4_ = auVar132._8_4_ * fVar207 + fVar239 * auVar227._0_4_;
      auVar253._12_4_ = auVar132._12_4_ * fVar208 + fVar241 * auVar227._4_4_;
      auVar277._0_4_ = auVar126._0_4_ * fVar191 + fVar210 * fVar117;
      auVar277._4_4_ = auVar126._4_4_ * fVar206 + fVar237 * fVar118;
      auVar277._8_4_ = auVar126._8_4_ * fVar207 + fVar239 * fVar117;
      auVar277._12_4_ = auVar126._12_4_ * fVar208 + fVar241 * fVar118;
      auVar315._0_4_ = fVar191 * local_6a0 + fVar210 * auVar267._16_4_;
      auVar315._4_4_ = fVar206 * fStack_69c + fVar237 * auVar267._20_4_;
      auVar315._8_4_ = fVar207 * fStack_698 + fVar239 * auVar267._16_4_;
      auVar315._12_4_ = fVar208 * fStack_694 + fVar241 * auVar267._20_4_;
      auVar144 = vsubps_avx(auVar265,auVar92);
      auVar126 = vmovshdup_avx(auVar325);
      auVar186 = vmovsldup_avx(auVar325);
      auVar266._0_4_ = auVar144._0_4_ * auVar186._0_4_ + auVar92._0_4_ * auVar126._0_4_;
      auVar266._4_4_ = auVar144._4_4_ * auVar186._4_4_ + auVar92._4_4_ * auVar126._4_4_;
      auVar266._8_4_ = auVar144._8_4_ * auVar186._8_4_ + auVar92._8_4_ * auVar126._8_4_;
      auVar266._12_4_ = auVar144._12_4_ * auVar186._12_4_ + auVar92._12_4_ * auVar126._12_4_;
      auVar80 = vmovshdup_avx(auVar266);
      auVar92 = vsubps_avx(auVar253,auVar101);
      auVar175._0_4_ = auVar92._0_4_ * 3.0;
      auVar175._4_4_ = auVar92._4_4_ * 3.0;
      auVar175._8_4_ = auVar92._8_4_ * 3.0;
      auVar175._12_4_ = auVar92._12_4_ * 3.0;
      auVar92 = vsubps_avx(auVar277,auVar253);
      auVar202._0_4_ = auVar92._0_4_ * 3.0;
      auVar202._4_4_ = auVar92._4_4_ * 3.0;
      auVar202._8_4_ = auVar92._8_4_ * 3.0;
      auVar202._12_4_ = auVar92._12_4_ * 3.0;
      auVar92 = vsubps_avx(auVar315,auVar277);
      auVar293._0_4_ = auVar92._0_4_ * 3.0;
      auVar293._4_4_ = auVar92._4_4_ * 3.0;
      auVar293._8_4_ = auVar92._8_4_ * 3.0;
      auVar293._12_4_ = auVar92._12_4_ * 3.0;
      auVar126 = vminps_avx(auVar202,auVar293);
      auVar92 = vmaxps_avx(auVar202,auVar293);
      auVar126 = vminps_avx(auVar175,auVar126);
      auVar92 = vmaxps_avx(auVar175,auVar92);
      auVar186 = vshufpd_avx(auVar126,auVar126,3);
      auVar144 = vshufpd_avx(auVar92,auVar92,3);
      auVar126 = vminps_avx(auVar126,auVar186);
      auVar92 = vmaxps_avx(auVar92,auVar144);
      auVar186 = vshufps_avx(ZEXT416((uint)(1.0 / fVar280)),ZEXT416((uint)(1.0 / fVar280)),0);
      auVar294._0_4_ = auVar186._0_4_ * auVar126._0_4_;
      auVar294._4_4_ = auVar186._4_4_ * auVar126._4_4_;
      auVar294._8_4_ = auVar186._8_4_ * auVar126._8_4_;
      auVar294._12_4_ = auVar186._12_4_ * auVar126._12_4_;
      auVar302._0_4_ = auVar186._0_4_ * auVar92._0_4_;
      auVar302._4_4_ = auVar186._4_4_ * auVar92._4_4_;
      auVar302._8_4_ = auVar186._8_4_ * auVar92._8_4_;
      auVar302._12_4_ = auVar186._12_4_ * auVar92._12_4_;
      auVar133 = ZEXT416((uint)(1.0 / (auVar80._0_4_ - auVar266._0_4_)));
      auVar92 = vshufpd_avx(auVar101,auVar101,3);
      auVar126 = vshufpd_avx(auVar253,auVar253,3);
      auVar186 = vshufpd_avx(auVar277,auVar277,3);
      auVar144 = vshufpd_avx(auVar315,auVar315,3);
      auVar92 = vsubps_avx(auVar92,auVar101);
      auVar132 = vsubps_avx(auVar126,auVar253);
      auVar172 = vsubps_avx(auVar186,auVar277);
      auVar144 = vsubps_avx(auVar144,auVar315);
      auVar126 = vminps_avx(auVar92,auVar132);
      auVar92 = vmaxps_avx(auVar92,auVar132);
      auVar186 = vminps_avx(auVar172,auVar144);
      auVar186 = vminps_avx(auVar126,auVar186);
      auVar126 = vmaxps_avx(auVar172,auVar144);
      auVar92 = vmaxps_avx(auVar92,auVar126);
      auVar126 = vshufps_avx(auVar133,auVar133,0);
      auVar346._0_4_ = auVar126._0_4_ * auVar186._0_4_;
      auVar346._4_4_ = auVar126._4_4_ * auVar186._4_4_;
      auVar346._8_4_ = auVar126._8_4_ * auVar186._8_4_;
      auVar346._12_4_ = auVar126._12_4_ * auVar186._12_4_;
      auVar357._0_4_ = auVar126._0_4_ * auVar92._0_4_;
      auVar357._4_4_ = auVar126._4_4_ * auVar92._4_4_;
      auVar357._8_4_ = auVar126._8_4_ * auVar92._8_4_;
      auVar357._12_4_ = auVar126._12_4_ * auVar92._12_4_;
      auVar92 = vmovsldup_avx(auVar266);
      auVar316._4_12_ = auVar92._4_12_;
      auVar316._0_4_ = fVar281;
      auVar327._4_12_ = auVar266._4_12_;
      auVar327._0_4_ = fVar279;
      auVar203._0_4_ = (fVar281 + fVar279) * 0.5;
      auVar203._4_4_ = (auVar92._4_4_ + auVar266._4_4_) * 0.5;
      auVar203._8_4_ = (auVar92._8_4_ + auVar266._8_4_) * 0.5;
      auVar203._12_4_ = (auVar92._12_4_ + auVar266._12_4_) * 0.5;
      auVar92 = vshufps_avx(auVar203,auVar203,0);
      fVar191 = auVar92._0_4_;
      fVar206 = auVar92._4_4_;
      fVar207 = auVar92._8_4_;
      fVar208 = auVar92._12_4_;
      local_630._0_4_ = auVar19._0_4_;
      local_630._4_4_ = auVar19._4_4_;
      fStack_628 = auVar19._8_4_;
      fStack_624 = auVar19._12_4_;
      auVar134._0_4_ = fVar191 * (float)local_350._0_4_ + (float)local_630._0_4_;
      auVar134._4_4_ = fVar206 * (float)local_350._4_4_ + (float)local_630._4_4_;
      auVar134._8_4_ = fVar207 * fStack_348 + fStack_628;
      auVar134._12_4_ = fVar208 * fStack_344 + fStack_624;
      local_640 = auVar20._0_4_;
      fStack_63c = auVar20._4_4_;
      fStack_638 = auVar20._8_4_;
      fStack_634 = auVar20._12_4_;
      auVar176._0_4_ = fVar191 * (float)local_360._0_4_ + local_640;
      auVar176._4_4_ = fVar206 * (float)local_360._4_4_ + fStack_63c;
      auVar176._8_4_ = fVar207 * fStack_358 + fStack_638;
      auVar176._12_4_ = fVar208 * fStack_354 + fStack_634;
      local_650 = auVar18._0_4_;
      fStack_64c = auVar18._4_4_;
      fStack_648 = auVar18._8_4_;
      fStack_644 = auVar18._12_4_;
      auVar254._0_4_ = fVar191 * (float)local_370._0_4_ + local_650;
      auVar254._4_4_ = fVar206 * (float)local_370._4_4_ + fStack_64c;
      auVar254._8_4_ = fVar207 * fStack_368 + fStack_648;
      auVar254._12_4_ = fVar208 * fStack_364 + fStack_644;
      auVar92 = vsubps_avx(auVar176,auVar134);
      auVar135._0_4_ = auVar134._0_4_ + fVar191 * auVar92._0_4_;
      auVar135._4_4_ = auVar134._4_4_ + fVar206 * auVar92._4_4_;
      auVar135._8_4_ = auVar134._8_4_ + fVar207 * auVar92._8_4_;
      auVar135._12_4_ = auVar134._12_4_ + fVar208 * auVar92._12_4_;
      auVar92 = vsubps_avx(auVar254,auVar176);
      auVar177._0_4_ = auVar176._0_4_ + fVar191 * auVar92._0_4_;
      auVar177._4_4_ = auVar176._4_4_ + fVar206 * auVar92._4_4_;
      auVar177._8_4_ = auVar176._8_4_ + fVar207 * auVar92._8_4_;
      auVar177._12_4_ = auVar176._12_4_ + fVar208 * auVar92._12_4_;
      auVar92 = vsubps_avx(auVar177,auVar135);
      fVar191 = auVar135._0_4_ + fVar191 * auVar92._0_4_;
      fVar206 = auVar135._4_4_ + fVar206 * auVar92._4_4_;
      auVar102._0_8_ = CONCAT44(fVar206,fVar191);
      auVar102._8_4_ = auVar135._8_4_ + fVar207 * auVar92._8_4_;
      auVar102._12_4_ = auVar135._12_4_ + fVar208 * auVar92._12_4_;
      fVar207 = auVar92._0_4_ * 3.0;
      fVar208 = auVar92._4_4_ * 3.0;
      auVar136._0_8_ = CONCAT44(fVar208,fVar207);
      auVar136._8_4_ = auVar92._8_4_ * 3.0;
      auVar136._12_4_ = auVar92._12_4_ * 3.0;
      auVar178._8_8_ = auVar102._0_8_;
      auVar178._0_8_ = auVar102._0_8_;
      auVar92 = vshufpd_avx(auVar102,auVar102,3);
      auVar126 = vshufps_avx(auVar203,auVar203,0x55);
      auVar172 = vsubps_avx(auVar92,auVar178);
      auVar339._0_4_ = auVar172._0_4_ * auVar126._0_4_ + fVar191;
      auVar339._4_4_ = auVar172._4_4_ * auVar126._4_4_ + fVar206;
      auVar339._8_4_ = auVar172._8_4_ * auVar126._8_4_ + fVar191;
      auVar339._12_4_ = auVar172._12_4_ * auVar126._12_4_ + fVar206;
      auVar179._8_8_ = auVar136._0_8_;
      auVar179._0_8_ = auVar136._0_8_;
      auVar92 = vshufpd_avx(auVar136,auVar136,1);
      auVar92 = vsubps_avx(auVar92,auVar179);
      auVar137._0_4_ = auVar92._0_4_ * auVar126._0_4_ + fVar207;
      auVar137._4_4_ = auVar92._4_4_ * auVar126._4_4_ + fVar208;
      auVar137._8_4_ = auVar92._8_4_ * auVar126._8_4_ + fVar207;
      auVar137._12_4_ = auVar92._12_4_ * auVar126._12_4_ + fVar208;
      auVar126 = vmovshdup_avx(auVar137);
      auVar255._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
      auVar255._8_4_ = auVar126._8_4_ ^ 0x80000000;
      auVar255._12_4_ = auVar126._12_4_ ^ 0x80000000;
      auVar186 = vmovshdup_avx(auVar172);
      auVar92 = vunpcklps_avx(auVar186,auVar255);
      auVar144 = vshufps_avx(auVar92,auVar255,4);
      auVar103._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
      auVar103._8_4_ = -auVar172._8_4_;
      auVar103._12_4_ = -auVar172._12_4_;
      auVar92 = vmovlhps_avx(auVar103,auVar137);
      auVar132 = vshufps_avx(auVar92,auVar137,8);
      auVar92 = ZEXT416((uint)(auVar137._0_4_ * auVar186._0_4_ - auVar172._0_4_ * auVar126._0_4_));
      auVar126 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = vdivps_avx(auVar144,auVar126);
      auVar126 = vdivps_avx(auVar132,auVar126);
      auVar132 = vinsertps_avx(auVar294,auVar346,0x1c);
      auVar172 = vinsertps_avx(auVar302,auVar357,0x1c);
      auVar133 = vinsertps_avx(auVar346,auVar294,0x4c);
      auVar268 = vinsertps_avx(auVar357,auVar302,0x4c);
      auVar186 = vmovsldup_avx(auVar92);
      auVar180._0_4_ = auVar186._0_4_ * auVar132._0_4_;
      auVar180._4_4_ = auVar186._4_4_ * auVar132._4_4_;
      auVar180._8_4_ = auVar186._8_4_ * auVar132._8_4_;
      auVar180._12_4_ = auVar186._12_4_ * auVar132._12_4_;
      auVar138._0_4_ = auVar172._0_4_ * auVar186._0_4_;
      auVar138._4_4_ = auVar172._4_4_ * auVar186._4_4_;
      auVar138._8_4_ = auVar172._8_4_ * auVar186._8_4_;
      auVar138._12_4_ = auVar172._12_4_ * auVar186._12_4_;
      auVar144 = vminps_avx(auVar180,auVar138);
      auVar186 = vmaxps_avx(auVar138,auVar180);
      auVar21 = vmovsldup_avx(auVar126);
      auVar358._0_4_ = auVar133._0_4_ * auVar21._0_4_;
      auVar358._4_4_ = auVar133._4_4_ * auVar21._4_4_;
      auVar358._8_4_ = auVar133._8_4_ * auVar21._8_4_;
      auVar358._12_4_ = auVar133._12_4_ * auVar21._12_4_;
      auVar181._0_4_ = auVar268._0_4_ * auVar21._0_4_;
      auVar181._4_4_ = auVar268._4_4_ * auVar21._4_4_;
      auVar181._8_4_ = auVar268._8_4_ * auVar21._8_4_;
      auVar181._12_4_ = auVar268._12_4_ * auVar21._12_4_;
      auVar21 = vminps_avx(auVar358,auVar181);
      auVar230._0_4_ = auVar144._0_4_ + auVar21._0_4_;
      auVar230._4_4_ = auVar144._4_4_ + auVar21._4_4_;
      auVar230._8_4_ = auVar144._8_4_ + auVar21._8_4_;
      auVar230._12_4_ = auVar144._12_4_ + auVar21._12_4_;
      auVar144 = vmaxps_avx(auVar181,auVar358);
      auVar21 = vsubps_avx(auVar316,auVar203);
      auVar81 = vsubps_avx(auVar327,auVar203);
      auVar139._0_4_ = auVar186._0_4_ + auVar144._0_4_;
      auVar139._4_4_ = auVar186._4_4_ + auVar144._4_4_;
      auVar139._8_4_ = auVar186._8_4_ + auVar144._8_4_;
      auVar139._12_4_ = auVar186._12_4_ + auVar144._12_4_;
      auVar182._8_8_ = 0x3f800000;
      auVar182._0_8_ = 0x3f800000;
      auVar186 = vsubps_avx(auVar182,auVar139);
      auVar144 = vsubps_avx(auVar182,auVar230);
      fVar239 = auVar21._0_4_;
      auVar231._0_4_ = fVar239 * auVar186._0_4_;
      fVar241 = auVar21._4_4_;
      auVar231._4_4_ = fVar241 * auVar186._4_4_;
      fVar117 = auVar21._8_4_;
      auVar231._8_4_ = fVar117 * auVar186._8_4_;
      fVar118 = auVar21._12_4_;
      auVar231._12_4_ = fVar118 * auVar186._12_4_;
      fVar207 = auVar81._0_4_;
      auVar140._0_4_ = fVar207 * auVar186._0_4_;
      fVar208 = auVar81._4_4_;
      auVar140._4_4_ = fVar208 * auVar186._4_4_;
      fVar210 = auVar81._8_4_;
      auVar140._8_4_ = fVar210 * auVar186._8_4_;
      fVar237 = auVar81._12_4_;
      auVar140._12_4_ = fVar237 * auVar186._12_4_;
      auVar317._0_4_ = fVar239 * auVar144._0_4_;
      auVar317._4_4_ = fVar241 * auVar144._4_4_;
      auVar317._8_4_ = fVar117 * auVar144._8_4_;
      auVar317._12_4_ = fVar118 * auVar144._12_4_;
      auVar183._0_4_ = fVar207 * auVar144._0_4_;
      auVar183._4_4_ = fVar208 * auVar144._4_4_;
      auVar183._8_4_ = fVar210 * auVar144._8_4_;
      auVar183._12_4_ = fVar237 * auVar144._12_4_;
      auVar186 = vminps_avx(auVar231,auVar317);
      auVar144 = vminps_avx(auVar140,auVar183);
      auVar21 = vminps_avx(auVar186,auVar144);
      auVar186 = vmaxps_avx(auVar317,auVar231);
      auVar144 = vmaxps_avx(auVar183,auVar140);
      auVar81 = vshufps_avx(auVar203,auVar203,0x54);
      auVar144 = vmaxps_avx(auVar144,auVar186);
      auVar91 = vshufps_avx(auVar339,auVar339,0);
      auVar158 = vshufps_avx(auVar339,auVar339,0x55);
      auVar186 = vhaddps_avx(auVar21,auVar21);
      auVar144 = vhaddps_avx(auVar144,auVar144);
      auVar204._0_4_ = auVar91._0_4_ * auVar92._0_4_ + auVar158._0_4_ * auVar126._0_4_;
      auVar204._4_4_ = auVar91._4_4_ * auVar92._4_4_ + auVar158._4_4_ * auVar126._4_4_;
      auVar204._8_4_ = auVar91._8_4_ * auVar92._8_4_ + auVar158._8_4_ * auVar126._8_4_;
      auVar204._12_4_ = auVar91._12_4_ * auVar92._12_4_ + auVar158._12_4_ * auVar126._12_4_;
      auVar21 = vsubps_avx(auVar81,auVar204);
      fVar191 = auVar21._0_4_ + auVar186._0_4_;
      fVar206 = auVar21._0_4_ + auVar144._0_4_;
      auVar186 = vmaxss_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar191));
      auVar144 = vminss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar279));
    } while (auVar144._0_4_ < auVar186._0_4_);
    auVar186 = vmovshdup_avx(auVar92);
    auVar104._0_4_ = auVar186._0_4_ * auVar132._0_4_;
    auVar104._4_4_ = auVar186._4_4_ * auVar132._4_4_;
    auVar104._8_4_ = auVar186._8_4_ * auVar132._8_4_;
    auVar104._12_4_ = auVar186._12_4_ * auVar132._12_4_;
    auVar141._0_4_ = auVar172._0_4_ * auVar186._0_4_;
    auVar141._4_4_ = auVar172._4_4_ * auVar186._4_4_;
    auVar141._8_4_ = auVar172._8_4_ * auVar186._8_4_;
    auVar141._12_4_ = auVar172._12_4_ * auVar186._12_4_;
    auVar144 = vminps_avx(auVar104,auVar141);
    auVar186 = vmaxps_avx(auVar141,auVar104);
    auVar132 = vmovshdup_avx(auVar126);
    auVar232._0_4_ = auVar133._0_4_ * auVar132._0_4_;
    auVar232._4_4_ = auVar133._4_4_ * auVar132._4_4_;
    auVar232._8_4_ = auVar133._8_4_ * auVar132._8_4_;
    auVar232._12_4_ = auVar133._12_4_ * auVar132._12_4_;
    auVar142._0_4_ = auVar268._0_4_ * auVar132._0_4_;
    auVar142._4_4_ = auVar268._4_4_ * auVar132._4_4_;
    auVar142._8_4_ = auVar268._8_4_ * auVar132._8_4_;
    auVar142._12_4_ = auVar268._12_4_ * auVar132._12_4_;
    auVar132 = vminps_avx(auVar232,auVar142);
    auVar184._0_4_ = auVar144._0_4_ + auVar132._0_4_;
    auVar184._4_4_ = auVar144._4_4_ + auVar132._4_4_;
    auVar184._8_4_ = auVar144._8_4_ + auVar132._8_4_;
    auVar184._12_4_ = auVar144._12_4_ + auVar132._12_4_;
    auVar144 = vmaxps_avx(auVar142,auVar232);
    auVar105._0_4_ = auVar186._0_4_ + auVar144._0_4_;
    auVar105._4_4_ = auVar186._4_4_ + auVar144._4_4_;
    auVar105._8_4_ = auVar186._8_4_ + auVar144._8_4_;
    auVar105._12_4_ = auVar186._12_4_ + auVar144._12_4_;
    auVar186 = vsubps_avx(auVar264,auVar105);
    auVar144 = vsubps_avx(auVar264,auVar184);
    auVar185._0_4_ = fVar239 * auVar186._0_4_;
    auVar185._4_4_ = fVar241 * auVar186._4_4_;
    auVar185._8_4_ = fVar117 * auVar186._8_4_;
    auVar185._12_4_ = fVar118 * auVar186._12_4_;
    auVar233._0_4_ = fVar239 * auVar144._0_4_;
    auVar233._4_4_ = fVar241 * auVar144._4_4_;
    auVar233._8_4_ = fVar117 * auVar144._8_4_;
    auVar233._12_4_ = fVar118 * auVar144._12_4_;
    auVar106._0_4_ = fVar207 * auVar186._0_4_;
    auVar106._4_4_ = fVar208 * auVar186._4_4_;
    auVar106._8_4_ = fVar210 * auVar186._8_4_;
    auVar106._12_4_ = fVar237 * auVar186._12_4_;
    auVar143._0_4_ = fVar207 * auVar144._0_4_;
    auVar143._4_4_ = fVar208 * auVar144._4_4_;
    auVar143._8_4_ = fVar210 * auVar144._8_4_;
    auVar143._12_4_ = fVar237 * auVar144._12_4_;
    auVar186 = vminps_avx(auVar185,auVar233);
    auVar144 = vminps_avx(auVar106,auVar143);
    auVar186 = vminps_avx(auVar186,auVar144);
    auVar144 = vmaxps_avx(auVar233,auVar185);
    auVar132 = vmaxps_avx(auVar143,auVar106);
    auVar186 = vhaddps_avx(auVar186,auVar186);
    auVar144 = vmaxps_avx(auVar132,auVar144);
    auVar144 = vhaddps_avx(auVar144,auVar144);
    auVar132 = vmovshdup_avx(auVar21);
    auVar172 = ZEXT416((uint)(auVar132._0_4_ + auVar186._0_4_));
    auVar186 = vmaxss_avx(auVar266,auVar172);
    auVar132 = ZEXT416((uint)(auVar132._0_4_ + auVar144._0_4_));
    auVar144 = vminss_avx(auVar132,auVar80);
  } while (auVar144._0_4_ < auVar186._0_4_);
  bVar73 = 0;
  if ((fVar281 < fVar191) && (fVar206 < fVar279)) {
    auVar186 = vcmpps_avx(auVar132,auVar80,1);
    auVar144 = vcmpps_avx(auVar266,auVar172,1);
    auVar186 = vandps_avx(auVar144,auVar186);
    bVar73 = auVar186[0];
  }
  auVar295._8_4_ = 0x7fffffff;
  auVar295._0_8_ = 0x7fffffff7fffffff;
  auVar295._12_4_ = 0x7fffffff;
  if (((uint)uVar71 < 4 && 0.001 <= fVar280) && (bVar73 & 1) == 0) goto LAB_008c14f4;
  lVar70 = 0xc9;
  do {
    lVar70 = lVar70 + -1;
    if (lVar70 == 0) goto LAB_008c0503;
    fVar280 = auVar21._0_4_;
    fVar279 = 1.0 - fVar280;
    auVar186 = ZEXT416((uint)(fVar279 * fVar279 * fVar279));
    auVar186 = vshufps_avx(auVar186,auVar186,0);
    auVar144 = ZEXT416((uint)(fVar280 * 3.0 * fVar279 * fVar279));
    auVar144 = vshufps_avx(auVar144,auVar144,0);
    auVar132 = ZEXT416((uint)(fVar279 * fVar280 * fVar280 * 3.0));
    auVar132 = vshufps_avx(auVar132,auVar132,0);
    auVar172 = ZEXT416((uint)(fVar280 * fVar280 * fVar280));
    auVar172 = vshufps_avx(auVar172,auVar172,0);
    fVar279 = (float)local_630._0_4_ * auVar186._0_4_ +
              local_640 * auVar144._0_4_ +
              (float)local_380._0_4_ * auVar172._0_4_ + local_650 * auVar132._0_4_;
    fVar280 = (float)local_630._4_4_ * auVar186._4_4_ +
              fStack_63c * auVar144._4_4_ +
              (float)local_380._4_4_ * auVar172._4_4_ + fStack_64c * auVar132._4_4_;
    auVar107._0_8_ = CONCAT44(fVar280,fVar279);
    auVar107._8_4_ =
         fStack_628 * auVar186._8_4_ +
         fStack_638 * auVar144._8_4_ + fStack_378 * auVar172._8_4_ + fStack_648 * auVar132._8_4_;
    auVar107._12_4_ =
         fStack_624 * auVar186._12_4_ +
         fStack_634 * auVar144._12_4_ + fStack_374 * auVar172._12_4_ + fStack_644 * auVar132._12_4_;
    auVar145._8_8_ = auVar107._0_8_;
    auVar145._0_8_ = auVar107._0_8_;
    auVar144 = vshufpd_avx(auVar107,auVar107,1);
    auVar186 = vmovshdup_avx(auVar21);
    auVar144 = vsubps_avx(auVar144,auVar145);
    auVar108._0_4_ = auVar186._0_4_ * auVar144._0_4_ + fVar279;
    auVar108._4_4_ = auVar186._4_4_ * auVar144._4_4_ + fVar280;
    auVar108._8_4_ = auVar186._8_4_ * auVar144._8_4_ + fVar279;
    auVar108._12_4_ = auVar186._12_4_ * auVar144._12_4_ + fVar280;
    auVar186 = vshufps_avx(auVar108,auVar108,0);
    auVar144 = vshufps_avx(auVar108,auVar108,0x55);
    auVar146._0_4_ = auVar92._0_4_ * auVar186._0_4_ + auVar126._0_4_ * auVar144._0_4_;
    auVar146._4_4_ = auVar92._4_4_ * auVar186._4_4_ + auVar126._4_4_ * auVar144._4_4_;
    auVar146._8_4_ = auVar92._8_4_ * auVar186._8_4_ + auVar126._8_4_ * auVar144._8_4_;
    auVar146._12_4_ = auVar92._12_4_ * auVar186._12_4_ + auVar126._12_4_ * auVar144._12_4_;
    auVar21 = vsubps_avx(auVar21,auVar146);
    auVar186 = vandps_avx(auVar295,auVar108);
    auVar144 = vshufps_avx(auVar186,auVar186,0xf5);
    auVar186 = vmaxss_avx(auVar144,auVar186);
  } while ((float)local_390._0_4_ <= auVar186._0_4_);
  fVar279 = auVar21._0_4_;
  if ((fVar279 < 0.0) || (1.0 < fVar279)) goto LAB_008c0503;
  auVar92 = vmovshdup_avx(auVar21);
  fVar280 = auVar92._0_4_;
  if ((fVar280 < 0.0) || (1.0 < fVar280)) goto LAB_008c0503;
  auVar92 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar268 = vinsertps_avx(auVar92,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar92 = vdpps_avx(auVar268,local_3a0,0x7f);
  auVar126 = vdpps_avx(auVar268,local_3b0,0x7f);
  auVar186 = vdpps_avx(auVar268,local_3e0,0x7f);
  auVar144 = vdpps_avx(auVar268,local_3f0,0x7f);
  auVar132 = vdpps_avx(auVar268,local_400,0x7f);
  auVar172 = vdpps_avx(auVar268,local_410,0x7f);
  fVar208 = 1.0 - fVar280;
  auVar133 = vdpps_avx(auVar268,local_3c0,0x7f);
  auVar268 = vdpps_avx(auVar268,local_3d0,0x7f);
  fVar210 = 1.0 - fVar279;
  fVar281 = auVar21._4_4_;
  fVar191 = auVar21._8_4_;
  fVar206 = auVar21._12_4_;
  fVar207 = fVar210 * fVar279 * fVar279 * 3.0;
  auVar256._0_4_ = fVar279 * fVar279 * fVar279;
  auVar256._4_4_ = fVar281 * fVar281 * fVar281;
  auVar256._8_4_ = fVar191 * fVar191 * fVar191;
  auVar256._12_4_ = fVar206 * fVar206 * fVar206;
  fVar281 = fVar279 * 3.0 * fVar210 * fVar210;
  fVar191 = fVar210 * fVar210 * fVar210;
  fVar279 = (fVar208 * auVar92._0_4_ + fVar280 * auVar186._0_4_) * fVar191 +
            (fVar208 * auVar126._0_4_ + fVar280 * auVar144._0_4_) * fVar281 +
            fVar207 * (fVar208 * auVar133._0_4_ + fVar280 * auVar132._0_4_) +
            auVar256._0_4_ * (auVar172._0_4_ * fVar280 + fVar208 * auVar268._0_4_);
  if ((fVar279 < fVar269) || (fVar280 = *(float *)(ray + k * 4 + 0x100), fVar280 < fVar279))
  goto LAB_008c0503;
  pGVar12 = (context->scene->geometries).items[uVar67].ptr;
  if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar73 = 1, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_008c14d4;
    local_f0 = vshufps_avx(auVar21,auVar21,0x55);
    auVar296._8_4_ = 0x3f800000;
    auVar296._0_8_ = 0x3f8000003f800000;
    auVar296._12_4_ = 0x3f800000;
    auVar92 = vsubps_avx(auVar296,local_f0);
    fVar206 = local_f0._0_4_;
    fVar208 = local_f0._4_4_;
    fVar237 = local_f0._8_4_;
    fVar239 = local_f0._12_4_;
    fVar241 = auVar92._0_4_;
    fVar117 = auVar92._4_4_;
    fVar118 = auVar92._8_4_;
    fVar119 = auVar92._12_4_;
    auVar303._0_4_ = fVar206 * (float)local_500._0_4_ + fVar241 * (float)local_4d0._0_4_;
    auVar303._4_4_ = fVar208 * (float)local_500._4_4_ + fVar117 * (float)local_4d0._4_4_;
    auVar303._8_4_ = fVar237 * fStack_4f8 + fVar118 * fStack_4c8;
    auVar303._12_4_ = fVar239 * fStack_4f4 + fVar119 * fStack_4c4;
    auVar318._0_4_ = fVar206 * (float)local_510._0_4_ + fVar241 * fVar120;
    auVar318._4_4_ = fVar208 * (float)local_510._4_4_ + fVar117 * fVar154;
    auVar318._8_4_ = fVar237 * fStack_508 + fVar118 * fVar155;
    auVar318._12_4_ = fVar239 * fStack_504 + fVar119 * fVar156;
    auVar328._0_4_ = fVar206 * (float)local_440._0_4_ + fVar241 * (float)local_4e0._0_4_;
    auVar328._4_4_ = fVar208 * (float)local_440._4_4_ + fVar117 * (float)local_4e0._4_4_;
    auVar328._8_4_ = fVar237 * fStack_438 + fVar118 * fStack_4d8;
    auVar328._12_4_ = fVar239 * fStack_434 + fVar119 * fStack_4d4;
    auVar297._0_4_ = fVar206 * fVar209 + fVar241 * (float)local_4f0._0_4_;
    auVar297._4_4_ = fVar208 * fVar238 + fVar117 * (float)local_4f0._4_4_;
    auVar297._8_4_ = fVar237 * fVar242 + fVar118 * fStack_4e8;
    auVar297._12_4_ = fVar239 * fVar78 + fVar119 * fStack_4e4;
    auVar144 = vsubps_avx(auVar318,auVar303);
    auVar132 = vsubps_avx(auVar328,auVar318);
    auVar172 = vsubps_avx(auVar297,auVar328);
    local_110 = vshufps_avx(auVar21,auVar21,0);
    fVar206 = local_110._0_4_;
    fVar237 = local_110._4_4_;
    fVar239 = local_110._8_4_;
    fVar117 = local_110._12_4_;
    auVar92 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
    fVar208 = auVar92._0_4_;
    fVar210 = auVar92._4_4_;
    fVar241 = auVar92._8_4_;
    fVar118 = auVar92._12_4_;
    auVar92 = vshufps_avx(auVar256,auVar256,0);
    auVar126 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
    auVar186 = vshufps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar281),0);
    auVar234._0_4_ =
         ((auVar132._0_4_ * fVar208 + auVar172._0_4_ * fVar206) * fVar206 +
         (auVar144._0_4_ * fVar208 + auVar132._0_4_ * fVar206) * fVar208) * 3.0;
    auVar234._4_4_ =
         ((auVar132._4_4_ * fVar210 + auVar172._4_4_ * fVar237) * fVar237 +
         (auVar144._4_4_ * fVar210 + auVar132._4_4_ * fVar237) * fVar210) * 3.0;
    auVar234._8_4_ =
         ((auVar132._8_4_ * fVar241 + auVar172._8_4_ * fVar239) * fVar239 +
         (auVar144._8_4_ * fVar241 + auVar132._8_4_ * fVar239) * fVar241) * 3.0;
    auVar234._12_4_ =
         ((auVar132._12_4_ * fVar118 + auVar172._12_4_ * fVar117) * fVar117 +
         (auVar144._12_4_ * fVar118 + auVar132._12_4_ * fVar117) * fVar118) * 3.0;
    auVar144 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
    auVar147._0_4_ =
         auVar144._0_4_ * (float)local_450._0_4_ +
         auVar186._0_4_ * (float)local_460._0_4_ +
         auVar92._0_4_ * (float)local_480._0_4_ + auVar126._0_4_ * (float)local_470._0_4_;
    auVar147._4_4_ =
         auVar144._4_4_ * (float)local_450._4_4_ +
         auVar186._4_4_ * (float)local_460._4_4_ +
         auVar92._4_4_ * (float)local_480._4_4_ + auVar126._4_4_ * (float)local_470._4_4_;
    auVar147._8_4_ =
         auVar144._8_4_ * fStack_448 +
         auVar186._8_4_ * fStack_458 + auVar92._8_4_ * fStack_478 + auVar126._8_4_ * fStack_468;
    auVar147._12_4_ =
         auVar144._12_4_ * fStack_444 +
         auVar186._12_4_ * fStack_454 + auVar92._12_4_ * fStack_474 + auVar126._12_4_ * fStack_464;
    auVar92 = vshufps_avx(auVar234,auVar234,0xc9);
    auVar187._0_4_ = auVar147._0_4_ * auVar92._0_4_;
    auVar187._4_4_ = auVar147._4_4_ * auVar92._4_4_;
    auVar187._8_4_ = auVar147._8_4_ * auVar92._8_4_;
    auVar187._12_4_ = auVar147._12_4_ * auVar92._12_4_;
    auVar92 = vshufps_avx(auVar147,auVar147,0xc9);
    auVar148._0_4_ = auVar234._0_4_ * auVar92._0_4_;
    auVar148._4_4_ = auVar234._4_4_ * auVar92._4_4_;
    auVar148._8_4_ = auVar234._8_4_ * auVar92._8_4_;
    auVar148._12_4_ = auVar234._12_4_ * auVar92._12_4_;
    auVar92 = vsubps_avx(auVar148,auVar187);
    local_170 = vshufps_avx(auVar92,auVar92,0x55);
    local_180[0] = (RTCHitN)local_170[0];
    local_180[1] = (RTCHitN)local_170[1];
    local_180[2] = (RTCHitN)local_170[2];
    local_180[3] = (RTCHitN)local_170[3];
    local_180[4] = (RTCHitN)local_170[4];
    local_180[5] = (RTCHitN)local_170[5];
    local_180[6] = (RTCHitN)local_170[6];
    local_180[7] = (RTCHitN)local_170[7];
    local_180[8] = (RTCHitN)local_170[8];
    local_180[9] = (RTCHitN)local_170[9];
    local_180[10] = (RTCHitN)local_170[10];
    local_180[0xb] = (RTCHitN)local_170[0xb];
    local_180[0xc] = (RTCHitN)local_170[0xc];
    local_180[0xd] = (RTCHitN)local_170[0xd];
    local_180[0xe] = (RTCHitN)local_170[0xe];
    local_180[0xf] = (RTCHitN)local_170[0xf];
    local_150 = vshufps_avx(auVar92,auVar92,0xaa);
    local_160 = local_150;
    local_130 = vshufps_avx(auVar92,auVar92,0);
    local_140 = local_130;
    local_120 = local_110;
    local_100 = local_f0;
    local_e0 = local_320._0_8_;
    uStack_d8 = local_320._8_8_;
    uStack_d0 = local_320._16_8_;
    uStack_c8 = local_320._24_8_;
    local_c0 = local_300;
    vcmpps_avx(local_300,local_300,0xf);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar279;
    local_540 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar74 & 0xf) << 4));
    local_530 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar74 >> 4) * 0x10);
    local_4b0.valid = (int *)local_540;
    local_4b0.geometryUserPtr = pGVar12->userPtr;
    local_4b0.context = context->user;
    local_4b0.ray = (RTCRayN *)ray;
    local_4b0.hit = local_180;
    local_4b0.N = 8;
    if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar12->occlusionFilterN)(&local_4b0);
    }
    auVar92 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
    auVar126 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
    auVar190._16_16_ = auVar126;
    auVar190._0_16_ = auVar92;
    auVar110 = _DAT_01f7b020 & ~auVar190;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar110 >> 0x7f,0) != '\0') ||
          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar110 >> 0xbf,0) != '\0') ||
        (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar110[0x1f] < '\0') {
      p_Var17 = context->args->filter;
      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var17)(&local_4b0);
      }
      auVar92 = vpcmpeqd_avx(local_540,ZEXT816(0) << 0x40);
      auVar126 = vpcmpeqd_avx(local_530,ZEXT816(0) << 0x40);
      auVar116._16_16_ = auVar126;
      auVar116._0_16_ = auVar92;
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
      auVar110 = vblendvps_avx(auVar153,*(undefined1 (*) [32])(local_4b0.ray + 0x100),auVar116);
      *(undefined1 (*) [32])(local_4b0.ray + 0x100) = auVar110;
      auVar110 = _DAT_01f7b020 & ~auVar116;
      if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0x7f,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar110 >> 0xbf,0) != '\0') ||
          (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar110[0x1f] < '\0') {
        bVar73 = 1;
        goto LAB_008c14d4;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar280;
  }
  bVar73 = 0;
LAB_008c14d4:
  bVar77 = (bool)(bVar77 | bVar73);
  goto LAB_008c0503;
LAB_008c14f4:
  auVar92 = vinsertps_avx(ZEXT416((uint)fVar281),ZEXT416((uint)fVar279),0x10);
  auVar363 = ZEXT1664(auVar92);
  auVar330 = ZEXT1664(auVar266);
  goto LAB_008bfe9d;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }